

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive PVar13;
  int iVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  uint uVar97;
  uint uVar98;
  uint uVar99;
  ulong uVar100;
  ulong uVar101;
  long lVar102;
  Geometry *pGVar103;
  long lVar104;
  undefined4 uVar105;
  undefined8 unaff_R13;
  ulong uVar106;
  long lVar107;
  undefined8 uVar108;
  float fVar125;
  vint4 bi_2;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar109 [16];
  float fVar124;
  float fVar126;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined8 uVar130;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar144 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar155 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  vint4 ai_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  vint4 ai;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined4 uVar184;
  vint4 bi;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  vint4 ai_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar216;
  float fVar217;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  float fVar218;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar215 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined4 uVar226;
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_78c;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  long local_710;
  ulong local_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  Primitive *local_6c0;
  Precalculations *local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [2] [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar236 [16];
  
  PVar13 = prim[1];
  uVar106 = (ulong)(byte)PVar13;
  fVar151 = *(float *)(prim + uVar106 * 0x19 + 0x12);
  auVar21 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar106 * 0x19 + 6));
  auVar109._0_4_ = fVar151 * auVar21._0_4_;
  auVar109._4_4_ = fVar151 * auVar21._4_4_;
  auVar109._8_4_ = fVar151 * auVar21._8_4_;
  auVar109._12_4_ = fVar151 * auVar21._12_4_;
  auVar185._0_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar185._4_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar185._8_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar185._12_4_ = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 5 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 6 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xb + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xc + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0xd + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x12 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x13 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar106 * 0x14 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar235._4_4_ = auVar185._0_4_;
  auVar235._0_4_ = auVar185._0_4_;
  auVar235._8_4_ = auVar185._0_4_;
  auVar235._12_4_ = auVar185._0_4_;
  auVar132 = vshufps_avx(auVar185,auVar185,0x55);
  auVar110 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar151 = auVar110._0_4_;
  auVar222._0_4_ = fVar151 * auVar114._0_4_;
  fVar124 = auVar110._4_4_;
  auVar222._4_4_ = fVar124 * auVar114._4_4_;
  fVar125 = auVar110._8_4_;
  auVar222._8_4_ = fVar125 * auVar114._8_4_;
  fVar126 = auVar110._12_4_;
  auVar222._12_4_ = fVar126 * auVar114._12_4_;
  auVar209._0_4_ = auVar20._0_4_ * fVar151;
  auVar209._4_4_ = auVar20._4_4_ * fVar124;
  auVar209._8_4_ = auVar20._8_4_ * fVar125;
  auVar209._12_4_ = auVar20._12_4_ * fVar126;
  auVar203._0_4_ = auVar152._0_4_ * fVar151;
  auVar203._4_4_ = auVar152._4_4_ * fVar124;
  auVar203._8_4_ = auVar152._8_4_ * fVar125;
  auVar203._12_4_ = auVar152._12_4_ * fVar126;
  auVar110 = vfmadd231ps_fma(auVar222,auVar132,auVar18);
  auVar153 = vfmadd231ps_fma(auVar209,auVar132,auVar133);
  auVar132 = vfmadd231ps_fma(auVar203,auVar111,auVar132);
  auVar167 = vfmadd231ps_fma(auVar110,auVar235,auVar21);
  auVar153 = vfmadd231ps_fma(auVar153,auVar235,auVar19);
  auVar178 = vfmadd231ps_fma(auVar132,auVar112,auVar235);
  auVar236._4_4_ = auVar109._0_4_;
  auVar236._0_4_ = auVar109._0_4_;
  auVar236._8_4_ = auVar109._0_4_;
  auVar236._12_4_ = auVar109._0_4_;
  auVar239 = ZEXT1664(auVar236);
  auVar132 = vshufps_avx(auVar109,auVar109,0x55);
  auVar110 = vshufps_avx(auVar109,auVar109,0xaa);
  fVar151 = auVar110._0_4_;
  auVar186._0_4_ = fVar151 * auVar114._0_4_;
  fVar124 = auVar110._4_4_;
  auVar186._4_4_ = fVar124 * auVar114._4_4_;
  fVar125 = auVar110._8_4_;
  auVar186._8_4_ = fVar125 * auVar114._8_4_;
  fVar126 = auVar110._12_4_;
  auVar186._12_4_ = fVar126 * auVar114._12_4_;
  auVar131._0_4_ = auVar20._0_4_ * fVar151;
  auVar131._4_4_ = auVar20._4_4_ * fVar124;
  auVar131._8_4_ = auVar20._8_4_ * fVar125;
  auVar131._12_4_ = auVar20._12_4_ * fVar126;
  auVar110._0_4_ = auVar152._0_4_ * fVar151;
  auVar110._4_4_ = auVar152._4_4_ * fVar124;
  auVar110._8_4_ = auVar152._8_4_ * fVar125;
  auVar110._12_4_ = auVar152._12_4_ * fVar126;
  auVar18 = vfmadd231ps_fma(auVar186,auVar132,auVar18);
  auVar114 = vfmadd231ps_fma(auVar131,auVar132,auVar133);
  auVar133 = vfmadd231ps_fma(auVar110,auVar132,auVar111);
  auVar20 = vfmadd231ps_fma(auVar18,auVar236,auVar21);
  auVar111 = vfmadd231ps_fma(auVar114,auVar236,auVar19);
  auVar152 = vfmadd231ps_fma(auVar133,auVar236,auVar112);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar167,local_2b0);
  auVar177._8_4_ = 0x219392ef;
  auVar177._0_8_ = 0x219392ef219392ef;
  auVar177._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar177,1);
  auVar18 = vblendvps_avx(auVar167,auVar177,auVar21);
  auVar21 = vandps_avx(auVar153,local_2b0);
  auVar21 = vcmpps_avx(auVar21,auVar177,1);
  auVar114 = vblendvps_avx(auVar153,auVar177,auVar21);
  auVar21 = vandps_avx(local_2b0,auVar178);
  auVar21 = vcmpps_avx(auVar21,auVar177,1);
  auVar21 = vblendvps_avx(auVar178,auVar177,auVar21);
  auVar19 = vrcpps_avx(auVar18);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = 0x3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar19,auVar204);
  auVar19 = vfmadd132ps_fma(auVar18,auVar19,auVar19);
  auVar18 = vrcpps_avx(auVar114);
  auVar114 = vfnmadd213ps_fma(auVar114,auVar18,auVar204);
  auVar133 = vfmadd132ps_fma(auVar114,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar21);
  auVar114 = vfnmadd213ps_fma(auVar21,auVar18,auVar204);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar106 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar112 = vfmadd132ps_fma(auVar114,auVar18,auVar18);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar178._0_4_ = auVar19._0_4_ * auVar21._0_4_;
  auVar178._4_4_ = auVar19._4_4_ * auVar21._4_4_;
  auVar178._8_4_ = auVar19._8_4_ * auVar21._8_4_;
  auVar178._12_4_ = auVar19._12_4_ * auVar21._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar106 * 9 + 6);
  auVar21 = vpmovsxwd_avx(auVar18);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar18 = vsubps_avx(auVar21,auVar20);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar106 * 0xe + 6);
  auVar21 = vpmovsxwd_avx(auVar114);
  auVar187._0_4_ = auVar19._0_4_ * auVar18._0_4_;
  auVar187._4_4_ = auVar19._4_4_ * auVar18._4_4_;
  auVar187._8_4_ = auVar19._8_4_ * auVar18._8_4_;
  auVar187._12_4_ = auVar19._12_4_ * auVar18._12_4_;
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar111);
  auVar195._0_4_ = auVar133._0_4_ * auVar21._0_4_;
  auVar195._4_4_ = auVar133._4_4_ * auVar21._4_4_;
  auVar195._8_4_ = auVar133._8_4_ * auVar21._8_4_;
  auVar195._12_4_ = auVar133._12_4_ * auVar21._12_4_;
  auVar153._1_3_ = 0;
  auVar153[0] = PVar13;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar111);
  auVar132._0_4_ = auVar133._0_4_ * auVar21._0_4_;
  auVar132._4_4_ = auVar133._4_4_ * auVar21._4_4_;
  auVar132._8_4_ = auVar133._8_4_ * auVar21._8_4_;
  auVar132._12_4_ = auVar133._12_4_ * auVar21._12_4_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar106 * 0x15 + 6);
  auVar21 = vpmovsxwd_avx(auVar133);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar18 = vsubps_avx(auVar21,auVar152);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar106 * 0x17 + 6);
  auVar21 = vpmovsxwd_avx(auVar20);
  auVar167._0_4_ = auVar112._0_4_ * auVar18._0_4_;
  auVar167._4_4_ = auVar112._4_4_ * auVar18._4_4_;
  auVar167._8_4_ = auVar112._8_4_ * auVar18._8_4_;
  auVar167._12_4_ = auVar112._12_4_ * auVar18._12_4_;
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar152);
  auVar111._0_4_ = auVar112._0_4_ * auVar21._0_4_;
  auVar111._4_4_ = auVar112._4_4_ * auVar21._4_4_;
  auVar111._8_4_ = auVar112._8_4_ * auVar21._8_4_;
  auVar111._12_4_ = auVar112._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar178,auVar187);
  auVar18 = vpminsd_avx(auVar195,auVar132);
  auVar21 = vmaxps_avx(auVar21,auVar18);
  auVar18 = vpminsd_avx(auVar167,auVar111);
  uVar105 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar210._4_4_ = uVar105;
  auVar210._0_4_ = uVar105;
  auVar210._8_4_ = uVar105;
  auVar210._12_4_ = uVar105;
  auVar18 = vmaxps_avx(auVar18,auVar210);
  auVar21 = vmaxps_avx(auVar21,auVar18);
  local_2c0._0_4_ = auVar21._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar21._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar21._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar178,auVar187);
  auVar18 = vpmaxsd_avx(auVar195,auVar132);
  auVar21 = vminps_avx(auVar21,auVar18);
  auVar18 = vpmaxsd_avx(auVar167,auVar111);
  fVar151 = (ray->super_RayK<1>).tfar;
  auVar152._4_4_ = fVar151;
  auVar152._0_4_ = fVar151;
  auVar152._8_4_ = fVar151;
  auVar152._12_4_ = fVar151;
  auVar18 = vminps_avx(auVar18,auVar152);
  auVar21 = vminps_avx(auVar21,auVar18);
  auVar153[4] = PVar13;
  auVar153._5_3_ = 0;
  auVar153[8] = PVar13;
  auVar153._9_3_ = 0;
  auVar153[0xc] = PVar13;
  auVar153._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar153,_DAT_01f4ad30);
  auVar112._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar112._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar112._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar112._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar21 = vcmpps_avx(local_2c0,auVar112,2);
  auVar21 = vandps_avx(auVar21,auVar18);
  uVar105 = vmovmskps_avx(auVar21);
  uVar106 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar105);
  local_480[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_480[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_480[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_480[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_6b8 = pre;
  local_6c0 = prim;
  do {
    auVar191 = local_3e0;
    if (uVar106 == 0) {
      return;
    }
    lVar102 = 0;
    for (uVar100 = uVar106; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
      lVar102 = lVar102 + 1;
    }
    uVar97 = *(uint *)(prim + 2);
    uVar99 = *(uint *)(prim + lVar102 * 4 + 6);
    local_788 = (ulong)uVar97;
    pGVar103 = (context->scene->geometries).items[uVar97].ptr;
    local_708 = (ulong)uVar99;
    uVar100 = (ulong)*(uint *)(*(long *)&pGVar103->field_0x58 +
                              pGVar103[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar99);
    p_Var15 = pGVar103[1].intersectionFilterN;
    lVar102 = *(long *)&pGVar103[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar102 + (long)p_Var15 * uVar100);
    local_6d0 = *(undefined8 *)*pauVar1;
    uStack_6c8 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar102 + (uVar100 + 1) * (long)p_Var15);
    local_6e0 = *(undefined8 *)*pauVar2;
    uStack_6d8 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar102 + (uVar100 + 2) * (long)p_Var15);
    local_6f0 = *(undefined8 *)*pauVar3;
    uStack_6e8 = *(undefined8 *)(*pauVar3 + 8);
    uVar106 = uVar106 - 1 & uVar106;
    pauVar4 = (undefined1 (*) [12])(lVar102 + (uVar100 + 3) * (long)p_Var15);
    local_200 = *(undefined8 *)*pauVar4;
    uStack_1f8 = *(undefined8 *)(*pauVar4 + 8);
    local_700 = (float)local_200;
    fStack_6fc = (float)((ulong)local_200 >> 0x20);
    fStack_6f8 = (float)uStack_1f8;
    fStack_6f4 = (float)((ulong)uStack_1f8 >> 0x20);
    if (uVar106 != 0) {
      uVar101 = uVar106 - 1 & uVar106;
      for (uVar100 = uVar106; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
      }
      if (uVar101 != 0) {
        for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar14 = (int)pGVar103[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar7 = (ray->super_RayK<1>).org.field_0;
    auVar18 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
    uVar105 = auVar18._0_4_;
    auVar168._4_4_ = uVar105;
    auVar168._0_4_ = uVar105;
    auVar168._8_4_ = uVar105;
    auVar168._12_4_ = uVar105;
    auVar21 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    aVar8 = (pre->ray_space).vx.field_0;
    aVar9 = (pre->ray_space).vy.field_0;
    fVar151 = (pre->ray_space).vz.field_0.m128[0];
    fVar124 = (pre->ray_space).vz.field_0.m128[1];
    fVar125 = (pre->ray_space).vz.field_0.m128[2];
    fVar126 = (pre->ray_space).vz.field_0.m128[3];
    auVar188._0_4_ = auVar18._0_4_ * fVar151;
    auVar188._4_4_ = auVar18._4_4_ * fVar124;
    auVar188._8_4_ = auVar18._8_4_ * fVar125;
    auVar188._12_4_ = auVar18._12_4_ * fVar126;
    auVar21 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar9,auVar21);
    auVar20 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar8,auVar168);
    auVar21 = vblendps_avx(auVar20,*pauVar1,8);
    auVar114 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
    uVar105 = auVar114._0_4_;
    auVar189._4_4_ = uVar105;
    auVar189._0_4_ = uVar105;
    auVar189._8_4_ = uVar105;
    auVar189._12_4_ = uVar105;
    auVar18 = vshufps_avx(auVar114,auVar114,0x55);
    auVar114 = vshufps_avx(auVar114,auVar114,0xaa);
    auVar205._0_4_ = auVar114._0_4_ * fVar151;
    auVar205._4_4_ = auVar114._4_4_ * fVar124;
    auVar205._8_4_ = auVar114._8_4_ * fVar125;
    auVar205._12_4_ = auVar114._12_4_ * fVar126;
    auVar18 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar9,auVar18);
    auVar112 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar8,auVar189);
    auVar18 = vblendps_avx(auVar112,*pauVar2,8);
    auVar19 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
    uVar105 = auVar19._0_4_;
    auVar196._4_4_ = uVar105;
    auVar196._0_4_ = uVar105;
    auVar196._8_4_ = uVar105;
    auVar196._12_4_ = uVar105;
    auVar114 = vshufps_avx(auVar19,auVar19,0x55);
    auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
    auVar228._0_4_ = auVar19._0_4_ * fVar151;
    auVar228._4_4_ = auVar19._4_4_ * fVar124;
    auVar228._8_4_ = auVar19._8_4_ * fVar125;
    auVar228._12_4_ = auVar19._12_4_ * fVar126;
    auVar114 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar9,auVar114);
    auVar111 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar8,auVar196);
    auVar114 = vblendps_avx(auVar111,*pauVar3,8);
    auVar84._12_4_ = fStack_6f4;
    auVar84._0_12_ = *pauVar4;
    auVar133 = vsubps_avx(auVar84,(undefined1  [16])aVar7);
    uVar105 = auVar133._0_4_;
    auVar206._4_4_ = uVar105;
    auVar206._0_4_ = uVar105;
    auVar206._8_4_ = uVar105;
    auVar206._12_4_ = uVar105;
    auVar19 = vshufps_avx(auVar133,auVar133,0x55);
    auVar133 = vshufps_avx(auVar133,auVar133,0xaa);
    auVar154._0_4_ = auVar133._0_4_ * fVar151;
    auVar154._4_4_ = auVar133._4_4_ * fVar124;
    auVar154._8_4_ = auVar133._8_4_ * fVar125;
    auVar154._12_4_ = auVar133._12_4_ * fVar126;
    auVar19 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar9,auVar19);
    auVar152 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar8,auVar206);
    auVar19 = vblendps_avx(auVar152,auVar84,8);
    auVar21 = vandps_avx(auVar21,local_2b0);
    auVar18 = vandps_avx(auVar18,local_2b0);
    auVar133 = vmaxps_avx(auVar21,auVar18);
    auVar21 = vandps_avx(auVar114,local_2b0);
    auVar18 = vandps_avx(auVar19,local_2b0);
    auVar21 = vmaxps_avx(auVar21,auVar18);
    auVar21 = vmaxps_avx(auVar133,auVar21);
    auVar18 = vmovshdup_avx(auVar21);
    auVar18 = vmaxss_avx(auVar18,auVar21);
    auVar21 = vshufpd_avx(auVar21,auVar21,1);
    auVar21 = vmaxss_avx(auVar21,auVar18);
    lVar102 = (long)iVar14;
    lVar104 = lVar102 * 0x44;
    auVar18 = vmovshdup_avx(auVar20);
    uVar108 = auVar18._0_8_;
    local_440._8_8_ = uVar108;
    local_440._0_8_ = uVar108;
    local_440._16_8_ = uVar108;
    local_440._24_8_ = uVar108;
    auVar18 = vmovshdup_avx(auVar112);
    uVar108 = auVar18._0_8_;
    local_3c0._8_8_ = uVar108;
    local_3c0._0_8_ = uVar108;
    local_3c0._16_8_ = uVar108;
    local_3c0._24_8_ = uVar108;
    auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 + 0x908);
    uVar226 = auVar111._0_4_;
    local_4a0._4_4_ = uVar226;
    local_4a0._0_4_ = uVar226;
    local_4a0._8_4_ = uVar226;
    local_4a0._12_4_ = uVar226;
    local_4a0._16_4_ = uVar226;
    local_4a0._20_4_ = uVar226;
    local_4a0._24_4_ = uVar226;
    local_4a0._28_4_ = uVar226;
    auVar18 = vmovshdup_avx(auVar111);
    uVar108 = auVar18._0_8_;
    local_640._8_8_ = uVar108;
    local_640._0_8_ = uVar108;
    local_640._16_8_ = uVar108;
    local_640._24_8_ = uVar108;
    fVar72 = *(float *)(catmullrom_basis0 + lVar104 + 0xd8c);
    fVar73 = *(float *)(catmullrom_basis0 + lVar104 + 0xd90);
    fVar74 = *(float *)(catmullrom_basis0 + lVar104 + 0xd94);
    fVar75 = *(float *)(catmullrom_basis0 + lVar104 + 0xd98);
    fVar76 = *(float *)(catmullrom_basis0 + lVar104 + 0xd9c);
    fVar77 = *(float *)(catmullrom_basis0 + lVar104 + 0xda0);
    fVar78 = *(float *)(catmullrom_basis0 + lVar104 + 0xda4);
    local_500 = auVar152._0_4_;
    auVar18 = vmovshdup_avx(auVar152);
    uVar108 = auVar18._0_8_;
    auVar231._0_4_ = local_500 * fVar72;
    auVar231._4_4_ = local_500 * fVar73;
    auVar231._8_4_ = local_500 * fVar74;
    auVar231._12_4_ = local_500 * fVar75;
    auVar231._16_4_ = local_500 * fVar76;
    auVar231._20_4_ = local_500 * fVar77;
    auVar231._28_36_ = auVar239._28_36_;
    auVar231._24_4_ = local_500 * fVar78;
    local_560 = auVar18._0_4_;
    auVar115._0_4_ = local_560 * fVar72;
    fStack_55c = auVar18._4_4_;
    auVar115._4_4_ = fStack_55c * fVar73;
    auVar115._8_4_ = local_560 * fVar74;
    auVar115._12_4_ = fStack_55c * fVar75;
    auVar115._16_4_ = local_560 * fVar76;
    auVar115._20_4_ = fStack_55c * fVar77;
    auVar115._24_4_ = local_560 * fVar78;
    auVar115._28_4_ = 0;
    auVar18 = vfmadd231ps_fma(auVar231._0_32_,auVar10,local_4a0);
    auVar114 = vfmadd231ps_fma(auVar115,auVar10,local_640);
    auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 + 0x484);
    uVar184 = auVar112._0_4_;
    local_580._4_4_ = uVar184;
    local_580._0_4_ = uVar184;
    local_580._8_4_ = uVar184;
    local_580._12_4_ = uVar184;
    local_580._16_4_ = uVar184;
    local_580._20_4_ = uVar184;
    local_580._24_4_ = uVar184;
    local_580._28_4_ = uVar184;
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar115,local_580);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar115,local_3c0);
    auVar164 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104);
    uVar105 = auVar20._0_4_;
    local_680._4_4_ = uVar105;
    local_680._0_4_ = uVar105;
    local_680._8_4_ = uVar105;
    local_680._12_4_ = uVar105;
    local_680._16_4_ = uVar105;
    local_680._20_4_ = uVar105;
    local_680._24_4_ = uVar105;
    local_680._28_4_ = uVar105;
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar164,local_680);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar164,local_440);
    auVar161 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 + 0x908);
    fVar79 = *(float *)(catmullrom_basis1 + lVar104 + 0xd8c);
    fVar80 = *(float *)(catmullrom_basis1 + lVar104 + 0xd90);
    fVar81 = *(float *)(catmullrom_basis1 + lVar104 + 0xd94);
    fVar82 = *(float *)(catmullrom_basis1 + lVar104 + 0xd98);
    fVar83 = *(float *)(catmullrom_basis1 + lVar104 + 0xd9c);
    fVar208 = *(float *)(catmullrom_basis1 + lVar104 + 0xda0);
    fVar216 = *(float *)(catmullrom_basis1 + lVar104 + 0xda4);
    fStack_4fc = local_500;
    fStack_4f8 = local_500;
    fStack_4f4 = local_500;
    fStack_4f0 = local_500;
    fStack_4ec = local_500;
    fStack_4e8 = local_500;
    fStack_4e4 = local_500;
    auVar120._0_4_ = local_500 * fVar79;
    auVar120._4_4_ = local_500 * fVar80;
    auVar120._8_4_ = local_500 * fVar81;
    auVar120._12_4_ = local_500 * fVar82;
    auVar120._16_4_ = local_500 * fVar83;
    auVar120._20_4_ = local_500 * fVar208;
    auVar120._24_4_ = local_500 * fVar216;
    auVar120._28_4_ = 0;
    auVar19 = vfmadd231ps_fma(auVar120,auVar161,local_4a0);
    auVar11._4_4_ = fStack_55c * fVar80;
    auVar11._0_4_ = local_560 * fVar79;
    auVar11._8_4_ = local_560 * fVar81;
    auVar11._12_4_ = fStack_55c * fVar82;
    auVar11._16_4_ = local_560 * fVar83;
    auVar11._20_4_ = fStack_55c * fVar208;
    auVar11._24_4_ = local_560 * fVar216;
    auVar11._28_4_ = uVar226;
    auVar133 = vfmadd231ps_fma(auVar11,auVar161,local_640);
    auVar11 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 + 0x484);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,local_580);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar11,local_3c0);
    auVar120 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar120,local_680);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar120,local_440);
    local_540 = ZEXT1632(auVar19);
    local_2e0 = ZEXT1632(auVar18);
    local_320 = vsubps_avx(local_540,local_2e0);
    _local_420 = ZEXT1632(auVar133);
    auVar116 = ZEXT1632(auVar114);
    auVar22 = vsubps_avx(_local_420,auVar116);
    auVar117._0_4_ = auVar114._0_4_ * local_320._0_4_;
    auVar117._4_4_ = auVar114._4_4_ * local_320._4_4_;
    auVar117._8_4_ = auVar114._8_4_ * local_320._8_4_;
    auVar117._12_4_ = auVar114._12_4_ * local_320._12_4_;
    auVar117._16_4_ = local_320._16_4_ * 0.0;
    auVar117._20_4_ = local_320._20_4_ * 0.0;
    auVar117._24_4_ = local_320._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    fVar151 = auVar22._0_4_;
    auVar136._0_4_ = auVar18._0_4_ * fVar151;
    fVar125 = auVar22._4_4_;
    auVar136._4_4_ = auVar18._4_4_ * fVar125;
    fVar127 = auVar22._8_4_;
    auVar136._8_4_ = auVar18._8_4_ * fVar127;
    fVar128 = auVar22._12_4_;
    auVar136._12_4_ = auVar18._12_4_ * fVar128;
    fVar129 = auVar22._16_4_;
    auVar136._16_4_ = fVar129 * 0.0;
    fVar17 = auVar22._20_4_;
    auVar136._20_4_ = fVar17 * 0.0;
    fVar227 = auVar22._24_4_;
    auVar136._24_4_ = fVar227 * 0.0;
    auVar136._28_4_ = 0;
    auVar117 = vsubps_avx(auVar117,auVar136);
    auVar18 = vpermilps_avx(*pauVar1,0xff);
    uVar130 = auVar18._0_8_;
    local_80._8_8_ = uVar130;
    local_80._0_8_ = uVar130;
    local_80._16_8_ = uVar130;
    local_80._24_8_ = uVar130;
    auVar114 = vpermilps_avx(*pauVar2,0xff);
    uVar130 = auVar114._0_8_;
    local_a0._8_8_ = uVar130;
    local_a0._0_8_ = uVar130;
    local_a0._16_8_ = uVar130;
    local_a0._24_8_ = uVar130;
    auVar114 = vpermilps_avx(*pauVar3,0xff);
    uVar130 = auVar114._0_8_;
    local_c0._8_8_ = uVar130;
    local_c0._0_8_ = uVar130;
    local_c0._16_8_ = uVar130;
    local_c0._24_8_ = uVar130;
    auVar85._12_4_ = fStack_6f4;
    auVar85._0_12_ = *pauVar4;
    auVar114 = vpermilps_avx(auVar85,0xff);
    local_e0 = auVar114._0_8_;
    fVar124 = auVar114._0_4_;
    auVar197._0_4_ = fVar72 * fVar124;
    fVar126 = auVar114._4_4_;
    auVar197._4_4_ = fVar73 * fVar126;
    auVar197._8_4_ = fVar74 * fVar124;
    auVar197._12_4_ = fVar75 * fVar126;
    auVar197._16_4_ = fVar76 * fVar124;
    auVar197._20_4_ = fVar77 * fVar126;
    auVar197._24_4_ = fVar78 * fVar124;
    auVar197._28_4_ = 0;
    auVar114 = vfmadd231ps_fma(auVar197,local_c0,auVar10);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar115,local_a0);
    auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar164,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar16._4_4_ = fVar126 * fVar80;
    auVar16._0_4_ = fVar124 * fVar79;
    auVar16._8_4_ = fVar124 * fVar81;
    auVar16._12_4_ = fVar126 * fVar82;
    auVar16._16_4_ = fVar124 * fVar83;
    auVar16._20_4_ = fVar126 * fVar208;
    auVar16._24_4_ = fVar124 * fVar216;
    auVar16._28_4_ = auVar164._28_4_;
    auVar19 = vfmadd231ps_fma(auVar16,auVar161,local_c0);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,local_a0);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar120,local_80);
    auVar163._4_4_ = fVar125 * fVar125;
    auVar163._0_4_ = fVar151 * fVar151;
    auVar163._8_4_ = fVar127 * fVar127;
    auVar163._12_4_ = fVar128 * fVar128;
    auVar163._16_4_ = fVar129 * fVar129;
    auVar163._20_4_ = fVar17 * fVar17;
    auVar163._24_4_ = fVar227 * fVar227;
    auVar163._28_4_ = auVar18._4_4_;
    auVar18 = vfmadd231ps_fma(auVar163,local_320,local_320);
    auVar16 = vmaxps_avx(ZEXT1632(auVar114),ZEXT1632(auVar19));
    auVar24._4_4_ = auVar18._4_4_ * auVar16._4_4_ * auVar16._4_4_;
    auVar24._0_4_ = auVar18._0_4_ * auVar16._0_4_ * auVar16._0_4_;
    auVar24._8_4_ = auVar18._8_4_ * auVar16._8_4_ * auVar16._8_4_;
    auVar24._12_4_ = auVar18._12_4_ * auVar16._12_4_ * auVar16._12_4_;
    auVar24._16_4_ = auVar16._16_4_ * auVar16._16_4_ * 0.0;
    auVar24._20_4_ = auVar16._20_4_ * auVar16._20_4_ * 0.0;
    auVar24._24_4_ = auVar16._24_4_ * auVar16._24_4_ * 0.0;
    auVar24._28_4_ = auVar16._28_4_;
    auVar23._4_4_ = auVar117._4_4_ * auVar117._4_4_;
    auVar23._0_4_ = auVar117._0_4_ * auVar117._0_4_;
    auVar23._8_4_ = auVar117._8_4_ * auVar117._8_4_;
    auVar23._12_4_ = auVar117._12_4_ * auVar117._12_4_;
    auVar23._16_4_ = auVar117._16_4_ * auVar117._16_4_;
    auVar23._20_4_ = auVar117._20_4_ * auVar117._20_4_;
    auVar23._24_4_ = auVar117._24_4_ * auVar117._24_4_;
    auVar23._28_4_ = auVar117._28_4_;
    auVar16 = vcmpps_avx(auVar23,auVar24,2);
    fVar151 = auVar21._0_4_ * 4.7683716e-07;
    auVar133 = ZEXT416((uint)fVar151);
    local_740._0_16_ = auVar133;
    auVar137._0_4_ = (float)iVar14;
    local_3e0._4_12_ = auVar161._4_12_;
    local_3e0._0_4_ = auVar137._0_4_;
    local_3e0._16_16_ = auVar191._16_16_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar137._16_4_ = auVar137._0_4_;
    auVar137._20_4_ = auVar137._0_4_;
    auVar137._24_4_ = auVar137._0_4_;
    auVar137._28_4_ = auVar137._0_4_;
    auVar191 = vcmpps_avx(_DAT_01f7b060,auVar137,1);
    auVar21 = vpermilps_avx(auVar20,0xaa);
    uVar130 = auVar21._0_8_;
    auVar173._8_8_ = uVar130;
    auVar173._0_8_ = uVar130;
    auVar173._16_8_ = uVar130;
    auVar173._24_8_ = uVar130;
    auVar21 = vpermilps_avx(auVar112,0xaa);
    uVar130 = auVar21._0_8_;
    local_100._8_8_ = uVar130;
    local_100._0_8_ = uVar130;
    local_100._16_8_ = uVar130;
    local_100._24_8_ = uVar130;
    auVar21 = vpermilps_avx(auVar111,0xaa);
    uVar130 = auVar21._0_8_;
    local_660._8_8_ = uVar130;
    local_660._0_8_ = uVar130;
    local_660._16_8_ = uVar130;
    local_660._24_8_ = uVar130;
    auVar18 = vpermilps_avx(auVar152,0xaa);
    uVar130 = auVar18._0_8_;
    register0x00001508 = uVar130;
    local_5c0 = uVar130;
    register0x00001510 = uVar130;
    register0x00001518 = uVar130;
    auVar231 = ZEXT3264(_local_5c0);
    auVar117 = auVar191 & auVar16;
    local_520._0_16_ = vpermilps_avx((undefined1  [16])aVar7,0xff);
    auVar163 = local_520;
    fStack_558 = local_560;
    fStack_554 = fStack_55c;
    fStack_550 = local_560;
    fStack_54c = fStack_55c;
    fStack_548 = local_560;
    fStack_544 = fStack_55c;
    local_520 = auVar163;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      auVar149 = ZEXT3264(local_5a0);
      auVar176 = ZEXT3264(local_4a0);
      auVar240 = ZEXT3264(local_640);
      auVar215 = ZEXT3264(CONCAT428(fStack_55c,
                                    CONCAT424(local_560,
                                              CONCAT420(fStack_55c,
                                                        CONCAT416(local_560,
                                                                  CONCAT412(fStack_55c,
                                                                            CONCAT48(local_560,
                                                                                     uVar108)))))));
      auVar166 = ZEXT3264(local_580);
      auVar239 = ZEXT3264(local_680);
      auVar233 = ZEXT1664(auVar133);
    }
    else {
      auVar16 = vandps_avx(auVar191,auVar16);
      fVar227 = auVar18._0_4_;
      fVar217 = auVar18._4_4_;
      auVar191._4_4_ = fVar217 * fVar80;
      auVar191._0_4_ = fVar227 * fVar79;
      auVar191._8_4_ = fVar227 * fVar81;
      auVar191._12_4_ = fVar217 * fVar82;
      auVar191._16_4_ = fVar227 * fVar83;
      auVar191._20_4_ = fVar217 * fVar208;
      auVar191._24_4_ = fVar227 * fVar216;
      auVar191._28_4_ = auVar16._28_4_;
      auVar18 = vfmadd213ps_fma(auVar161,local_660,auVar191);
      auVar18 = vfmadd213ps_fma(auVar11,local_100,ZEXT1632(auVar18));
      auVar18 = vfmadd213ps_fma(auVar120,auVar173,ZEXT1632(auVar18));
      local_300 = ZEXT1632(auVar18);
      auVar161._4_4_ = fVar217 * fVar73;
      auVar161._0_4_ = fVar227 * fVar72;
      auVar161._8_4_ = fVar227 * fVar74;
      auVar161._12_4_ = fVar217 * fVar75;
      auVar161._16_4_ = fVar227 * fVar76;
      auVar161._20_4_ = fVar217 * fVar77;
      auVar161._24_4_ = fVar227 * fVar78;
      auVar161._28_4_ = auVar16._28_4_;
      auVar18 = vfmadd213ps_fma(auVar10,local_660,auVar161);
      auVar18 = vfmadd213ps_fma(auVar115,local_100,ZEXT1632(auVar18));
      auVar191 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 + 0x1210);
      auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 + 0x1694);
      local_5e0 = auVar173;
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar104 + 0x1b18);
      fVar124 = *(float *)(catmullrom_basis0 + lVar104 + 0x1f9c);
      fVar125 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa0);
      fVar126 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa4);
      fVar127 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fa8);
      fVar128 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fac);
      fVar129 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fb0);
      fVar17 = *(float *)(catmullrom_basis0 + lVar104 + 0x1fb4);
      auVar26._4_4_ = local_500 * fVar125;
      auVar26._0_4_ = local_500 * fVar124;
      auVar26._8_4_ = local_500 * fVar126;
      auVar26._12_4_ = local_500 * fVar127;
      auVar26._16_4_ = local_500 * fVar128;
      auVar26._20_4_ = local_500 * fVar129;
      auVar26._24_4_ = local_500 * fVar17;
      auVar26._28_4_ = auVar21._4_4_;
      auVar190._0_4_ = local_560 * fVar124;
      auVar190._4_4_ = fStack_55c * fVar125;
      auVar190._8_4_ = local_560 * fVar126;
      auVar190._12_4_ = fStack_55c * fVar127;
      auVar190._16_4_ = local_560 * fVar128;
      auVar190._20_4_ = fStack_55c * fVar129;
      auVar190._24_4_ = local_560 * fVar17;
      auVar190._28_4_ = 0;
      auVar27._4_4_ = fVar125 * fVar217;
      auVar27._0_4_ = fVar124 * fVar227;
      auVar27._8_4_ = fVar126 * fVar227;
      auVar27._12_4_ = fVar127 * fVar217;
      auVar27._16_4_ = fVar128 * fVar227;
      auVar27._20_4_ = fVar129 * fVar217;
      auVar27._24_4_ = fVar17 * fVar227;
      auVar27._28_4_ = *(undefined4 *)(catmullrom_basis0 + lVar104 + 0x1fb8);
      auVar21 = vfmadd231ps_fma(auVar26,auVar115,local_4a0);
      auVar20 = vfmadd231ps_fma(auVar190,auVar115,local_640);
      auVar112 = vfmadd231ps_fma(auVar27,local_660,auVar115);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar10,local_580);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,local_3c0);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_100,auVar10);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar191,local_680);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar191,local_440);
      auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar191,auVar173);
      fVar124 = *(float *)(catmullrom_basis1 + lVar104 + 0x1f9c);
      fVar125 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa0);
      fVar126 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa4);
      fVar127 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fa8);
      fVar128 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fac);
      fVar129 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fb0);
      fVar17 = *(float *)(catmullrom_basis1 + lVar104 + 0x1fb4);
      auVar10._4_4_ = local_500 * fVar125;
      auVar10._0_4_ = local_500 * fVar124;
      auVar10._8_4_ = local_500 * fVar126;
      auVar10._12_4_ = local_500 * fVar127;
      auVar10._16_4_ = local_500 * fVar128;
      auVar10._20_4_ = local_500 * fVar129;
      auVar10._24_4_ = local_500 * fVar17;
      auVar10._28_4_ = auVar115._28_4_;
      auVar28._4_4_ = fStack_55c * fVar125;
      auVar28._0_4_ = local_560 * fVar124;
      auVar28._8_4_ = local_560 * fVar126;
      auVar28._12_4_ = fStack_55c * fVar127;
      auVar28._16_4_ = local_560 * fVar128;
      auVar28._20_4_ = fStack_55c * fVar129;
      auVar28._24_4_ = local_560 * fVar17;
      auVar28._28_4_ = local_500;
      auVar29._4_4_ = fVar217 * fVar125;
      auVar29._0_4_ = fVar227 * fVar124;
      auVar29._8_4_ = fVar227 * fVar126;
      auVar29._12_4_ = fVar217 * fVar127;
      auVar29._16_4_ = fVar227 * fVar128;
      auVar29._20_4_ = fVar217 * fVar129;
      auVar29._24_4_ = fVar227 * fVar17;
      auVar29._28_4_ = fStack_55c;
      auVar191 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 + 0x1b18);
      auVar111 = vfmadd231ps_fma(auVar10,auVar191,local_4a0);
      auVar152 = vfmadd231ps_fma(auVar28,auVar191,local_640);
      auVar132 = vfmadd231ps_fma(auVar29,auVar191,local_660);
      auVar191 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 + 0x1694);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar191,local_580);
      auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar191,local_3c0);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_100,auVar191);
      auVar191 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar104 + 0x1210);
      auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar191,local_680);
      auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar191,local_440);
      auVar138._8_4_ = 0x7fffffff;
      auVar138._0_8_ = 0x7fffffff7fffffff;
      auVar138._12_4_ = 0x7fffffff;
      auVar138._16_4_ = 0x7fffffff;
      auVar138._20_4_ = 0x7fffffff;
      auVar138._24_4_ = 0x7fffffff;
      auVar138._28_4_ = 0x7fffffff;
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar173,auVar191);
      auVar191 = vandps_avx(ZEXT1632(auVar21),auVar138);
      auVar10 = vandps_avx(ZEXT1632(auVar20),auVar138);
      auVar10 = vmaxps_avx(auVar191,auVar10);
      auVar191 = vandps_avx(ZEXT1632(auVar112),auVar138);
      auVar191 = vmaxps_avx(auVar10,auVar191);
      auVar211._4_4_ = fVar151;
      auVar211._0_4_ = fVar151;
      auVar211._8_4_ = fVar151;
      auVar211._12_4_ = fVar151;
      auVar211._16_4_ = fVar151;
      auVar211._20_4_ = fVar151;
      auVar211._24_4_ = fVar151;
      auVar211._28_4_ = fVar151;
      auVar191 = vcmpps_avx(auVar191,auVar211,1);
      auVar115 = vblendvps_avx(ZEXT1632(auVar21),local_320,auVar191);
      auVar161 = vblendvps_avx(ZEXT1632(auVar20),auVar22,auVar191);
      auVar191 = vandps_avx(ZEXT1632(auVar111),auVar138);
      auVar10 = vandps_avx(ZEXT1632(auVar152),auVar138);
      auVar10 = vmaxps_avx(auVar191,auVar10);
      auVar191 = vandps_avx(ZEXT1632(auVar132),auVar138);
      auVar191 = vmaxps_avx(auVar10,auVar191);
      auVar10 = vcmpps_avx(auVar191,auVar211,1);
      auVar191 = vblendvps_avx(ZEXT1632(auVar111),local_320,auVar10);
      auVar10 = vblendvps_avx(ZEXT1632(auVar152),auVar22,auVar10);
      auVar21 = vfmadd213ps_fma(auVar164,auVar173,ZEXT1632(auVar18));
      auVar18 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar161,auVar161);
      auVar164 = vrsqrtps_avx(ZEXT1632(auVar18));
      fVar151 = auVar164._0_4_;
      fVar124 = auVar164._4_4_;
      fVar125 = auVar164._8_4_;
      fVar126 = auVar164._12_4_;
      fVar127 = auVar164._16_4_;
      fVar128 = auVar164._20_4_;
      fVar129 = auVar164._24_4_;
      auVar22._4_4_ = fVar124 * fVar124 * fVar124 * auVar18._4_4_ * -0.5;
      auVar22._0_4_ = fVar151 * fVar151 * fVar151 * auVar18._0_4_ * -0.5;
      auVar22._8_4_ = fVar125 * fVar125 * fVar125 * auVar18._8_4_ * -0.5;
      auVar22._12_4_ = fVar126 * fVar126 * fVar126 * auVar18._12_4_ * -0.5;
      auVar22._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar22._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar22._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar22._28_4_ = 0;
      auVar237._8_4_ = 0x3fc00000;
      auVar237._0_8_ = 0x3fc000003fc00000;
      auVar237._12_4_ = 0x3fc00000;
      auVar237._16_4_ = 0x3fc00000;
      auVar237._20_4_ = 0x3fc00000;
      auVar237._24_4_ = 0x3fc00000;
      auVar237._28_4_ = 0x3fc00000;
      auVar18 = vfmadd231ps_fma(auVar22,auVar237,auVar164);
      fVar151 = auVar18._0_4_;
      fVar124 = auVar18._4_4_;
      auVar30._4_4_ = fVar124 * auVar161._4_4_;
      auVar30._0_4_ = fVar151 * auVar161._0_4_;
      fVar125 = auVar18._8_4_;
      auVar30._8_4_ = fVar125 * auVar161._8_4_;
      fVar126 = auVar18._12_4_;
      auVar30._12_4_ = fVar126 * auVar161._12_4_;
      auVar30._16_4_ = auVar161._16_4_ * 0.0;
      auVar30._20_4_ = auVar161._20_4_ * 0.0;
      auVar30._24_4_ = auVar161._24_4_ * 0.0;
      auVar30._28_4_ = 0;
      auVar31._4_4_ = fVar124 * -auVar115._4_4_;
      auVar31._0_4_ = fVar151 * -auVar115._0_4_;
      auVar31._8_4_ = fVar125 * -auVar115._8_4_;
      auVar31._12_4_ = fVar126 * -auVar115._12_4_;
      auVar31._16_4_ = -auVar115._16_4_ * 0.0;
      auVar31._20_4_ = -auVar115._20_4_ * 0.0;
      auVar31._24_4_ = -auVar115._24_4_ * 0.0;
      auVar31._28_4_ = auVar164._28_4_;
      auVar18 = vfmadd213ps_fma(auVar191,auVar191,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,auVar10);
      auVar164 = vrsqrtps_avx(ZEXT1632(auVar18));
      auVar32._28_4_ = uVar184;
      auVar32._0_28_ =
           ZEXT1628(CONCAT412(fVar126 * 0.0,
                              CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar151 * 0.0))));
      fVar151 = auVar164._0_4_;
      fVar124 = auVar164._4_4_;
      fVar125 = auVar164._8_4_;
      fVar126 = auVar164._12_4_;
      fVar127 = auVar164._16_4_;
      fVar128 = auVar164._20_4_;
      fVar129 = auVar164._24_4_;
      auVar229._0_4_ = fVar151 * fVar151 * fVar151 * auVar18._0_4_ * -0.5;
      auVar229._4_4_ = fVar124 * fVar124 * fVar124 * auVar18._4_4_ * -0.5;
      auVar229._8_4_ = fVar125 * fVar125 * fVar125 * auVar18._8_4_ * -0.5;
      auVar229._12_4_ = fVar126 * fVar126 * fVar126 * auVar18._12_4_ * -0.5;
      auVar229._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar229._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar229._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar229._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar229,auVar237,auVar164);
      fVar151 = auVar18._0_4_;
      auVar223._0_4_ = auVar10._0_4_ * fVar151;
      fVar124 = auVar18._4_4_;
      auVar223._4_4_ = auVar10._4_4_ * fVar124;
      fVar125 = auVar18._8_4_;
      auVar223._8_4_ = auVar10._8_4_ * fVar125;
      fVar126 = auVar18._12_4_;
      auVar223._12_4_ = auVar10._12_4_ * fVar126;
      auVar223._16_4_ = auVar10._16_4_ * 0.0;
      auVar223._20_4_ = auVar10._20_4_ * 0.0;
      auVar223._24_4_ = auVar10._24_4_ * 0.0;
      auVar223._28_4_ = 0;
      auVar164._4_4_ = fVar124 * -auVar191._4_4_;
      auVar164._0_4_ = fVar151 * -auVar191._0_4_;
      auVar164._8_4_ = fVar125 * -auVar191._8_4_;
      auVar164._12_4_ = fVar126 * -auVar191._12_4_;
      auVar164._16_4_ = -auVar191._16_4_ * 0.0;
      auVar164._20_4_ = -auVar191._20_4_ * 0.0;
      auVar164._24_4_ = -auVar191._24_4_ * 0.0;
      auVar164._28_4_ = auVar115._28_4_ ^ 0x80000000;
      auVar33._28_4_ = 0xbf000000;
      auVar33._0_28_ =
           ZEXT1628(CONCAT412(fVar126 * 0.0,
                              CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar151 * 0.0))));
      auVar18 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar114),local_2e0);
      auVar191 = ZEXT1632(auVar114);
      auVar20 = vfmadd213ps_fma(auVar31,auVar191,auVar116);
      auVar112 = vfmadd213ps_fma(auVar32,auVar191,ZEXT1632(auVar21));
      auVar132 = vfnmadd213ps_fma(auVar30,auVar191,local_2e0);
      auVar111 = vfmadd213ps_fma(auVar223,ZEXT1632(auVar19),local_540);
      auVar110 = vfnmadd213ps_fma(auVar31,auVar191,auVar116);
      auVar191 = ZEXT1632(auVar19);
      auVar152 = vfmadd213ps_fma(auVar164,auVar191,_local_420);
      local_760 = ZEXT1632(auVar114);
      auVar178 = vfnmadd231ps_fma(ZEXT1632(auVar21),local_760,auVar32);
      auVar114 = vfmadd213ps_fma(auVar33,auVar191,local_300);
      auVar153 = vfnmadd213ps_fma(auVar223,auVar191,local_540);
      auVar167 = vfnmadd213ps_fma(auVar164,auVar191,_local_420);
      local_400 = ZEXT1632(auVar19);
      auVar109 = vfnmadd231ps_fma(local_300,local_400,auVar33);
      auVar191 = vsubps_avx(ZEXT1632(auVar152),ZEXT1632(auVar110));
      auVar10 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar178));
      auVar116._4_4_ = auVar178._4_4_ * auVar191._4_4_;
      auVar116._0_4_ = auVar178._0_4_ * auVar191._0_4_;
      auVar116._8_4_ = auVar178._8_4_ * auVar191._8_4_;
      auVar116._12_4_ = auVar178._12_4_ * auVar191._12_4_;
      auVar116._16_4_ = auVar191._16_4_ * 0.0;
      auVar116._20_4_ = auVar191._20_4_ * 0.0;
      auVar116._24_4_ = auVar191._24_4_ * 0.0;
      auVar116._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar116,ZEXT1632(auVar110),auVar10);
      auVar34._4_4_ = auVar10._4_4_ * auVar132._4_4_;
      auVar34._0_4_ = auVar10._0_4_ * auVar132._0_4_;
      auVar34._8_4_ = auVar10._8_4_ * auVar132._8_4_;
      auVar34._12_4_ = auVar10._12_4_ * auVar132._12_4_;
      auVar34._16_4_ = auVar10._16_4_ * 0.0;
      auVar34._20_4_ = auVar10._20_4_ * 0.0;
      auVar34._24_4_ = auVar10._24_4_ * 0.0;
      auVar34._28_4_ = auVar10._28_4_;
      auVar10 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar132));
      auVar21 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar178),auVar10);
      auVar35._4_4_ = auVar110._4_4_ * auVar10._4_4_;
      auVar35._0_4_ = auVar110._0_4_ * auVar10._0_4_;
      auVar35._8_4_ = auVar110._8_4_ * auVar10._8_4_;
      auVar35._12_4_ = auVar110._12_4_ * auVar10._12_4_;
      auVar35._16_4_ = auVar10._16_4_ * 0.0;
      auVar35._20_4_ = auVar10._20_4_ * 0.0;
      auVar35._24_4_ = auVar10._24_4_ * 0.0;
      auVar35._28_4_ = auVar10._28_4_;
      auVar161 = ZEXT1632(auVar132);
      auVar132 = vfmsub231ps_fma(auVar35,auVar161,auVar191);
      auVar191 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar191,ZEXT1632(auVar21));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar191,ZEXT1632(auVar19));
      auVar22 = vcmpps_avx(ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20,2);
      local_4c0 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar18),auVar22);
      local_4e0 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar20),auVar22);
      auVar191 = vblendvps_avx(ZEXT1632(auVar109),ZEXT1632(auVar112),auVar22);
      auVar10 = vblendvps_avx(auVar161,ZEXT1632(auVar111),auVar22);
      auVar115 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar152),auVar22);
      auVar164 = vblendvps_avx(ZEXT1632(auVar178),ZEXT1632(auVar114),auVar22);
      auVar161 = vblendvps_avx(ZEXT1632(auVar111),auVar161,auVar22);
      auVar11 = vblendvps_avx(ZEXT1632(auVar152),ZEXT1632(auVar110),auVar22);
      auVar21 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
      local_780 = ZEXT1632(auVar21);
      auVar120 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar178),auVar22);
      auVar16 = vsubps_avx(auVar161,local_4c0);
      auVar11 = vsubps_avx(auVar11,local_4e0);
      auVar117 = vsubps_avx(auVar120,auVar191);
      auVar163 = vsubps_avx(local_4c0,auVar10);
      auVar24 = vsubps_avx(local_4e0,auVar115);
      auVar23 = vsubps_avx(auVar191,auVar164);
      auVar36._4_4_ = auVar117._4_4_ * local_4c0._4_4_;
      auVar36._0_4_ = auVar117._0_4_ * local_4c0._0_4_;
      auVar36._8_4_ = auVar117._8_4_ * local_4c0._8_4_;
      auVar36._12_4_ = auVar117._12_4_ * local_4c0._12_4_;
      auVar36._16_4_ = auVar117._16_4_ * local_4c0._16_4_;
      auVar36._20_4_ = auVar117._20_4_ * local_4c0._20_4_;
      auVar36._24_4_ = auVar117._24_4_ * local_4c0._24_4_;
      auVar36._28_4_ = auVar120._28_4_;
      auVar18 = vfmsub231ps_fma(auVar36,auVar191,auVar16);
      auVar37._4_4_ = auVar16._4_4_ * local_4e0._4_4_;
      auVar37._0_4_ = auVar16._0_4_ * local_4e0._0_4_;
      auVar37._8_4_ = auVar16._8_4_ * local_4e0._8_4_;
      auVar37._12_4_ = auVar16._12_4_ * local_4e0._12_4_;
      auVar37._16_4_ = auVar16._16_4_ * local_4e0._16_4_;
      auVar37._20_4_ = auVar16._20_4_ * local_4e0._20_4_;
      auVar37._24_4_ = auVar16._24_4_ * local_4e0._24_4_;
      auVar37._28_4_ = auVar161._28_4_;
      auVar114 = vfmsub231ps_fma(auVar37,local_4c0,auVar11);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
      auVar118._0_4_ = auVar11._0_4_ * auVar191._0_4_;
      auVar118._4_4_ = auVar11._4_4_ * auVar191._4_4_;
      auVar118._8_4_ = auVar11._8_4_ * auVar191._8_4_;
      auVar118._12_4_ = auVar11._12_4_ * auVar191._12_4_;
      auVar118._16_4_ = auVar11._16_4_ * auVar191._16_4_;
      auVar118._20_4_ = auVar11._20_4_ * auVar191._20_4_;
      auVar118._24_4_ = auVar11._24_4_ * auVar191._24_4_;
      auVar118._28_4_ = 0;
      auVar114 = vfmsub231ps_fma(auVar118,local_4e0,auVar117);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
      auVar119._0_4_ = auVar23._0_4_ * auVar10._0_4_;
      auVar119._4_4_ = auVar23._4_4_ * auVar10._4_4_;
      auVar119._8_4_ = auVar23._8_4_ * auVar10._8_4_;
      auVar119._12_4_ = auVar23._12_4_ * auVar10._12_4_;
      auVar119._16_4_ = auVar23._16_4_ * auVar10._16_4_;
      auVar119._20_4_ = auVar23._20_4_ * auVar10._20_4_;
      auVar119._24_4_ = auVar23._24_4_ * auVar10._24_4_;
      auVar119._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar119,auVar163,auVar164);
      auVar139._0_4_ = auVar24._0_4_ * auVar164._0_4_;
      auVar139._4_4_ = auVar24._4_4_ * auVar164._4_4_;
      auVar139._8_4_ = auVar24._8_4_ * auVar164._8_4_;
      auVar139._12_4_ = auVar24._12_4_ * auVar164._12_4_;
      auVar139._16_4_ = auVar24._16_4_ * auVar164._16_4_;
      auVar139._20_4_ = auVar24._20_4_ * auVar164._20_4_;
      auVar139._24_4_ = auVar24._24_4_ * auVar164._24_4_;
      auVar139._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar139,auVar115,auVar23);
      auVar38._4_4_ = auVar163._4_4_ * auVar115._4_4_;
      auVar38._0_4_ = auVar163._0_4_ * auVar115._0_4_;
      auVar38._8_4_ = auVar163._8_4_ * auVar115._8_4_;
      auVar38._12_4_ = auVar163._12_4_ * auVar115._12_4_;
      auVar38._16_4_ = auVar163._16_4_ * auVar115._16_4_;
      auVar38._20_4_ = auVar163._20_4_ * auVar115._20_4_;
      auVar38._24_4_ = auVar163._24_4_ * auVar115._24_4_;
      auVar38._28_4_ = auVar115._28_4_;
      auVar20 = vfmsub231ps_fma(auVar38,auVar24,auVar10);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
      auVar115 = vmaxps_avx(ZEXT1632(auVar114),ZEXT1632(auVar19));
      auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
      auVar18 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
      auVar21 = vpand_avx(auVar18,auVar21);
      auVar115 = vpmovsxwd_avx2(auVar21);
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0x7f,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar115 >> 0xbf,0) == '\0') &&
          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar115[0x1f]) {
LAB_01174e54:
        auVar149 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                      CONCAT816(local_480[1]._16_8_,
                                                CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_))));
        auVar225._8_4_ = local_560;
        auVar225._0_8_ = uVar108;
        auVar225._12_4_ = fStack_55c;
        auVar225._16_4_ = local_560;
        auVar225._20_4_ = fStack_55c;
        auVar225._24_4_ = local_560;
        auVar225._28_4_ = fStack_55c;
      }
      else {
        local_780 = ZEXT1632(auVar21);
        auVar140._0_4_ = auVar11._0_4_ * auVar23._0_4_;
        auVar140._4_4_ = auVar11._4_4_ * auVar23._4_4_;
        auVar140._8_4_ = auVar11._8_4_ * auVar23._8_4_;
        auVar140._12_4_ = auVar11._12_4_ * auVar23._12_4_;
        auVar140._16_4_ = auVar11._16_4_ * auVar23._16_4_;
        auVar140._20_4_ = auVar11._20_4_ * auVar23._20_4_;
        auVar140._24_4_ = auVar11._24_4_ * auVar23._24_4_;
        auVar140._28_4_ = 0;
        auVar111 = vfmsub231ps_fma(auVar140,auVar24,auVar117);
        auVar39._4_4_ = auVar117._4_4_ * auVar163._4_4_;
        auVar39._0_4_ = auVar117._0_4_ * auVar163._0_4_;
        auVar39._8_4_ = auVar117._8_4_ * auVar163._8_4_;
        auVar39._12_4_ = auVar117._12_4_ * auVar163._12_4_;
        auVar39._16_4_ = auVar117._16_4_ * auVar163._16_4_;
        auVar39._20_4_ = auVar117._20_4_ * auVar163._20_4_;
        auVar39._24_4_ = auVar117._24_4_ * auVar163._24_4_;
        auVar39._28_4_ = auVar10._28_4_;
        auVar112 = vfmsub231ps_fma(auVar39,auVar16,auVar23);
        auVar40._4_4_ = auVar16._4_4_ * auVar24._4_4_;
        auVar40._0_4_ = auVar16._0_4_ * auVar24._0_4_;
        auVar40._8_4_ = auVar16._8_4_ * auVar24._8_4_;
        auVar40._12_4_ = auVar16._12_4_ * auVar24._12_4_;
        auVar40._16_4_ = auVar16._16_4_ * auVar24._16_4_;
        auVar40._20_4_ = auVar16._20_4_ * auVar24._20_4_;
        auVar40._24_4_ = auVar16._24_4_ * auVar24._24_4_;
        auVar40._28_4_ = auVar16._28_4_;
        auVar152 = vfmsub231ps_fma(auVar40,auVar163,auVar11);
        auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar152));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar111),ZEXT832(0) << 0x20);
        auVar10 = vrcpps_avx(ZEXT1632(auVar20));
        auVar224._8_4_ = 0x3f800000;
        auVar224._0_8_ = 0x3f8000003f800000;
        auVar224._12_4_ = 0x3f800000;
        auVar224._16_4_ = 0x3f800000;
        auVar224._20_4_ = 0x3f800000;
        auVar224._24_4_ = 0x3f800000;
        auVar224._28_4_ = 0x3f800000;
        auVar18 = vfnmadd213ps_fma(auVar10,ZEXT1632(auVar20),auVar224);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar10,auVar10);
        auVar41._4_4_ = auVar152._4_4_ * auVar191._4_4_;
        auVar41._0_4_ = auVar152._0_4_ * auVar191._0_4_;
        auVar41._8_4_ = auVar152._8_4_ * auVar191._8_4_;
        auVar41._12_4_ = auVar152._12_4_ * auVar191._12_4_;
        auVar41._16_4_ = auVar191._16_4_ * 0.0;
        auVar41._20_4_ = auVar191._20_4_ * 0.0;
        auVar41._24_4_ = auVar191._24_4_ * 0.0;
        auVar41._28_4_ = auVar191._28_4_;
        auVar112 = vfmadd231ps_fma(auVar41,ZEXT1632(auVar112),local_4e0);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar111),local_4c0);
        fVar124 = auVar18._0_4_;
        fVar125 = auVar18._4_4_;
        fVar126 = auVar18._8_4_;
        fVar127 = auVar18._12_4_;
        auVar42._28_4_ = auVar164._28_4_;
        auVar42._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * auVar112._12_4_,
                                CONCAT48(fVar126 * auVar112._8_4_,
                                         CONCAT44(fVar125 * auVar112._4_4_,fVar124 * auVar112._0_4_)
                                        )));
        auVar141._8_8_ = local_520._0_8_;
        auVar141._0_8_ = local_520._0_8_;
        auVar141._16_8_ = local_520._0_8_;
        auVar141._24_8_ = local_520._0_8_;
        fVar151 = (ray->super_RayK<1>).tfar;
        auVar183._4_4_ = fVar151;
        auVar183._0_4_ = fVar151;
        auVar183._8_4_ = fVar151;
        auVar183._12_4_ = fVar151;
        auVar183._16_4_ = fVar151;
        auVar183._20_4_ = fVar151;
        auVar183._24_4_ = fVar151;
        auVar183._28_4_ = fVar151;
        auVar191 = vcmpps_avx(auVar141,auVar42,2);
        auVar10 = vcmpps_avx(auVar42,auVar183,2);
        auVar191 = vandps_avx(auVar10,auVar191);
        auVar18 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
        auVar21 = vpand_avx(auVar18,auVar21);
        auVar191 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar191 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar191 >> 0xbf,0) == '\0') &&
            (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar191[0x1f]) goto LAB_01174e54;
        auVar191 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar20),4);
        auVar18 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
        auVar21 = vpand_avx(auVar21,auVar18);
        auVar191 = vpmovsxwd_avx2(auVar21);
        auVar149 = ZEXT3264(CONCAT824(local_480[1]._24_8_,
                                      CONCAT816(local_480[1]._16_8_,
                                                CONCAT88(local_480[1]._8_8_,local_480[1]._0_8_))));
        auVar225._8_4_ = local_560;
        auVar225._0_8_ = uVar108;
        auVar225._12_4_ = fStack_55c;
        auVar225._16_4_ = local_560;
        auVar225._20_4_ = fStack_55c;
        auVar225._24_4_ = local_560;
        auVar225._28_4_ = fStack_55c;
        if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar191 >> 0x7f,0) != '\0') ||
              (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar191 >> 0xbf,0) != '\0') ||
            (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar191[0x1f] < '\0') {
          auVar115 = ZEXT1632(CONCAT412(fVar127 * auVar114._12_4_,
                                        CONCAT48(fVar126 * auVar114._8_4_,
                                                 CONCAT44(fVar125 * auVar114._4_4_,
                                                          fVar124 * auVar114._0_4_))));
          auVar164 = ZEXT1632(CONCAT412(fVar127 * auVar19._12_4_,
                                        CONCAT48(fVar126 * auVar19._8_4_,
                                                 CONCAT44(fVar125 * auVar19._4_4_,
                                                          fVar124 * auVar19._0_4_))));
          auVar198._8_4_ = 0x3f800000;
          auVar198._0_8_ = 0x3f8000003f800000;
          auVar198._12_4_ = 0x3f800000;
          auVar198._16_4_ = 0x3f800000;
          auVar198._20_4_ = 0x3f800000;
          auVar198._24_4_ = 0x3f800000;
          auVar198._28_4_ = 0x3f800000;
          auVar10 = vsubps_avx(auVar198,auVar115);
          _local_160 = vblendvps_avx(auVar10,auVar115,auVar22);
          auVar10 = vsubps_avx(auVar198,auVar164);
          local_360 = vblendvps_avx(auVar10,auVar164,auVar22);
          auVar149 = ZEXT3264(auVar191);
          local_340 = auVar42;
        }
      }
      auVar239 = ZEXT3264(local_680);
      auVar233 = ZEXT1664(auVar133);
      auVar231 = ZEXT3264(_local_5c0);
      auVar191 = auVar149._0_32_;
      auVar166 = ZEXT3264(auVar173);
      if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar191 >> 0x7f,0) != '\0') ||
            (auVar149 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar191 >> 0xbf,0) != '\0') ||
          (auVar149 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar149[0x1f] < '\0') {
        auVar10 = vsubps_avx(local_400,local_760);
        auVar21 = vfmadd213ps_fma(auVar10,_local_160,local_760);
        fVar151 = pre->depth_scale;
        auVar43._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar151;
        auVar43._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar151;
        auVar43._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar151;
        auVar43._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar151;
        auVar43._16_4_ = fVar151 * 0.0;
        auVar43._20_4_ = fVar151 * 0.0;
        auVar43._24_4_ = fVar151 * 0.0;
        auVar43._28_4_ = 0;
        auVar10 = vcmpps_avx(local_340,auVar43,6);
        auVar115 = auVar191 & auVar10;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar115 >> 0x7f,0) != '\0') ||
              (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0xbf,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar115[0x1f] < '\0') {
          auVar142._8_4_ = 0xbf800000;
          auVar142._0_8_ = 0xbf800000bf800000;
          auVar142._12_4_ = 0xbf800000;
          auVar142._16_4_ = 0xbf800000;
          auVar142._20_4_ = 0xbf800000;
          auVar142._24_4_ = 0xbf800000;
          auVar142._28_4_ = 0xbf800000;
          auVar162._8_4_ = 0x40000000;
          auVar162._0_8_ = 0x4000000040000000;
          auVar162._12_4_ = 0x40000000;
          auVar162._16_4_ = 0x40000000;
          auVar162._20_4_ = 0x40000000;
          auVar162._24_4_ = 0x40000000;
          auVar162._28_4_ = 0x40000000;
          auVar21 = vfmadd213ps_fma(local_360,auVar162,auVar142);
          local_2a0 = _local_160;
          local_360 = ZEXT1632(auVar21);
          auVar115 = local_360;
          local_280 = ZEXT1632(auVar21);
          local_260 = local_340;
          local_240 = 0;
          local_23c = iVar14;
          local_230 = *(undefined8 *)*pauVar1;
          uStack_228 = *(undefined8 *)(*pauVar1 + 8);
          local_220 = *(undefined8 *)*pauVar2;
          uStack_218 = *(undefined8 *)(*pauVar2 + 8);
          local_210 = *(undefined8 *)*pauVar3;
          uStack_208 = *(undefined8 *)(*pauVar3 + 8);
          auVar240 = ZEXT3264(local_640);
          auVar215 = ZEXT3264(auVar225);
          local_360 = auVar115;
          if ((pGVar103->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar191 = vandps_avx(auVar191,auVar10);
            local_480[0] = auVar191;
            fVar151 = 1.0 / auVar137._0_4_;
            local_1c0[0] = fVar151 * ((float)local_160._0_4_ + 0.0);
            local_1c0[1] = fVar151 * ((float)local_160._4_4_ + 1.0);
            local_1c0[2] = fVar151 * (fStack_158 + 2.0);
            local_1c0[3] = fVar151 * (fStack_154 + 3.0);
            fStack_1b0 = fVar151 * (fStack_150 + 4.0);
            fStack_1ac = fVar151 * (fStack_14c + 5.0);
            fStack_1a8 = fVar151 * (fStack_148 + 6.0);
            fStack_1a4 = fStack_144 + 7.0;
            local_360._0_8_ = auVar21._0_8_;
            local_360._8_8_ = auVar21._8_8_;
            local_1a0 = local_360._0_8_;
            uStack_198 = local_360._8_8_;
            uStack_190 = 0;
            uStack_188 = 0;
            local_180 = local_340;
            auVar143._8_4_ = 0x7f800000;
            auVar143._0_8_ = 0x7f8000007f800000;
            auVar143._12_4_ = 0x7f800000;
            auVar143._16_4_ = 0x7f800000;
            auVar143._20_4_ = 0x7f800000;
            auVar143._24_4_ = 0x7f800000;
            auVar143._28_4_ = 0x7f800000;
            auVar10 = vblendvps_avx(auVar143,local_340,auVar191);
            auVar115 = vshufps_avx(auVar10,auVar10,0xb1);
            auVar115 = vminps_avx(auVar10,auVar115);
            auVar164 = vshufpd_avx(auVar115,auVar115,5);
            auVar115 = vminps_avx(auVar115,auVar164);
            auVar164 = vpermpd_avx2(auVar115,0x4e);
            auVar115 = vminps_avx(auVar115,auVar164);
            auVar10 = vcmpps_avx(auVar10,auVar115,0);
            auVar115 = auVar191 & auVar10;
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0x7f,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar115 >> 0xbf,0) != '\0') ||
                (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar115[0x1f] < '\0') {
              auVar191 = vandps_avx(auVar10,auVar191);
            }
            uVar98 = vmovmskps_avx(auVar191);
            uVar25 = 0;
            for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              uVar25 = uVar25 + 1;
            }
            uVar100 = (ulong)uVar25;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar103->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_780 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_710 = lVar102;
              do {
                local_604 = local_1c0[uVar100];
                local_600 = *(undefined4 *)((long)&local_1a0 + uVar100 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar100 * 4);
                fVar151 = 1.0 - local_604;
                auVar114 = ZEXT416((uint)local_604);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                          ZEXT416(0xc0a00000));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_604 * local_604 * 3.0)),
                                          ZEXT416((uint)(local_604 + local_604)),auVar21);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                          ZEXT416(0x40000000));
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                          ZEXT416((uint)(fVar151 + fVar151)),auVar21);
                auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(local_604 * (fVar151 + fVar151))),
                                           ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                auVar114 = vfmadd231ss_fma(ZEXT416((uint)(local_604 * local_604)),auVar114,
                                           ZEXT416((uint)(fVar151 * -2.0)));
                fVar151 = auVar21._0_4_ * 0.5;
                fVar124 = auVar114._0_4_ * 0.5;
                auVar181._0_4_ = fVar124 * local_700;
                auVar181._4_4_ = fVar124 * fStack_6fc;
                auVar181._8_4_ = fVar124 * fStack_6f8;
                auVar181._12_4_ = fVar124 * fStack_6f4;
                auVar159._4_4_ = fVar151;
                auVar159._0_4_ = fVar151;
                auVar159._8_4_ = fVar151;
                auVar159._12_4_ = fVar151;
                auVar88._8_8_ = uStack_6e8;
                auVar88._0_8_ = local_6f0;
                auVar21 = vfmadd132ps_fma(auVar159,auVar181,auVar88);
                fVar151 = auVar18._0_4_ * 0.5;
                auVar182._4_4_ = fVar151;
                auVar182._0_4_ = fVar151;
                auVar182._8_4_ = fVar151;
                auVar182._12_4_ = fVar151;
                auVar91._8_8_ = uStack_6d8;
                auVar91._0_8_ = local_6e0;
                auVar21 = vfmadd132ps_fma(auVar182,auVar21,auVar91);
                fVar151 = auVar19._0_4_ * 0.5;
                auVar160._4_4_ = fVar151;
                auVar160._0_4_ = fVar151;
                auVar160._8_4_ = fVar151;
                auVar160._12_4_ = fVar151;
                auVar94._8_8_ = uStack_6c8;
                auVar94._0_8_ = local_6d0;
                auVar21 = vfmadd132ps_fma(auVar160,auVar21,auVar94);
                local_6b0.context = context->user;
                local_610 = vmovlps_avx(auVar21);
                local_608 = vextractps_avx(auVar21,2);
                local_5fc = (int)local_708;
                local_5f8 = (int)local_788;
                local_5f4 = (local_6b0.context)->instID[0];
                local_5f0 = (local_6b0.context)->instPrimID[0];
                local_78c = -1;
                local_6b0.valid = &local_78c;
                local_6b0.geometryUserPtr = pGVar103->userPtr;
                local_6b0.ray = (RTCRayN *)ray;
                local_6b0.hit = (RTCHitN *)&local_610;
                local_6b0.N = 1;
                local_760._0_8_ = uVar100;
                if (pGVar103->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011750d8:
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar103->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var15)(&local_6b0);
                    auVar233 = ZEXT1664(local_740._0_16_);
                    auVar231 = ZEXT3264(_local_5c0);
                    auVar166 = ZEXT3264(local_5e0);
                    auVar239 = ZEXT3264(local_680);
                    auVar215 = ZEXT3264(CONCAT428(fStack_544,
                                                  CONCAT424(fStack_548,
                                                            CONCAT420(fStack_54c,
                                                                      CONCAT416(fStack_550,
                                                                                CONCAT412(fStack_554
                                                                                          ,CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                    auVar240 = ZEXT3264(local_640);
                    lVar102 = local_710;
                    pre = local_6b8;
                    uVar100 = local_760._0_8_;
                    if (*local_6b0.valid == 0) goto LAB_011751e4;
                  }
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_6b0.hit;
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_6b0.hit + 4);
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_6b0.hit + 8);
                  *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                  *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                  *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                  *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                  *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                  *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                }
                else {
                  (*pGVar103->intersectionFilterN)(&local_6b0);
                  auVar233 = ZEXT1664(local_740._0_16_);
                  auVar231 = ZEXT3264(_local_5c0);
                  auVar166 = ZEXT3264(local_5e0);
                  auVar239 = ZEXT3264(local_680);
                  auVar215 = ZEXT3264(CONCAT428(fStack_544,
                                                CONCAT424(fStack_548,
                                                          CONCAT420(fStack_54c,
                                                                    CONCAT416(fStack_550,
                                                                              CONCAT412(fStack_554,
                                                                                        CONCAT48(
                                                  fStack_558,CONCAT44(fStack_55c,local_560))))))));
                  auVar240 = ZEXT3264(local_640);
                  lVar102 = local_710;
                  pre = local_6b8;
                  uVar100 = local_760._0_8_;
                  if (*local_6b0.valid != 0) goto LAB_011750d8;
LAB_011751e4:
                  (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                  lVar102 = local_710;
                  pre = local_6b8;
                  uVar100 = local_760._0_8_;
                }
                auVar173 = auVar166._0_32_;
                *(undefined4 *)(local_480[0] + uVar100 * 4) = 0;
                auVar115 = local_480[0];
                fVar151 = (ray->super_RayK<1>).tfar;
                auVar123._4_4_ = fVar151;
                auVar123._0_4_ = fVar151;
                auVar123._8_4_ = fVar151;
                auVar123._12_4_ = fVar151;
                auVar123._16_4_ = fVar151;
                auVar123._20_4_ = fVar151;
                auVar123._24_4_ = fVar151;
                auVar123._28_4_ = fVar151;
                auVar10 = vcmpps_avx(local_340,auVar123,2);
                auVar191 = vandps_avx(auVar10,local_480[0]);
                local_480[0] = auVar191;
                auVar115 = auVar115 & auVar10;
                prim = local_6c0;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar115 >> 0x7f,0) == '\0') &&
                      (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0xbf,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar115[0x1f]) goto LAB_01173f1e;
                auVar148._8_4_ = 0x7f800000;
                auVar148._0_8_ = 0x7f8000007f800000;
                auVar148._12_4_ = 0x7f800000;
                auVar148._16_4_ = 0x7f800000;
                auVar148._20_4_ = 0x7f800000;
                auVar148._24_4_ = 0x7f800000;
                auVar148._28_4_ = 0x7f800000;
                auVar10 = vblendvps_avx(auVar148,local_340,auVar191);
                auVar115 = vshufps_avx(auVar10,auVar10,0xb1);
                auVar115 = vminps_avx(auVar10,auVar115);
                auVar164 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar164);
                auVar164 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar164);
                auVar10 = vcmpps_avx(auVar10,auVar115,0);
                auVar115 = auVar191 & auVar10;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0x7f,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0xbf,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar115[0x1f] < '\0') {
                  auVar191 = vandps_avx(auVar10,auVar191);
                }
                local_780 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar99 = vmovmskps_avx(auVar191);
                uVar97 = 0;
                for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                  uVar97 = uVar97 + 1;
                }
                uVar100 = (ulong)uVar97;
              } while( true );
            }
            fVar151 = local_1c0[uVar100];
            fVar124 = 1.0 - fVar151;
            auVar114 = ZEXT416((uint)fVar151);
            auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,ZEXT416(0xc0a00000));
            auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                      ZEXT416((uint)(fVar151 + fVar151)),auVar21);
            auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,ZEXT416(0x40000000));
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * fVar124 * -3.0)),
                                      ZEXT416((uint)(fVar124 + fVar124)),auVar21);
            auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar124 + fVar124))),
                                       ZEXT416((uint)fVar124),ZEXT416((uint)fVar124));
            auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar114,
                                       ZEXT416((uint)(fVar124 * -2.0)));
            fVar124 = auVar21._0_4_ * 0.5;
            fVar125 = auVar114._0_4_ * 0.5;
            auVar169._0_4_ = fVar125 * local_700;
            auVar169._4_4_ = fVar125 * fStack_6fc;
            auVar169._8_4_ = fVar125 * fStack_6f8;
            auVar169._12_4_ = fVar125 * fStack_6f4;
            auVar134._4_4_ = fVar124;
            auVar134._0_4_ = fVar124;
            auVar134._8_4_ = fVar124;
            auVar134._12_4_ = fVar124;
            auVar21 = vfmadd132ps_fma(auVar134,auVar169,*pauVar3);
            fVar124 = auVar18._0_4_ * 0.5;
            auVar170._4_4_ = fVar124;
            auVar170._0_4_ = fVar124;
            auVar170._8_4_ = fVar124;
            auVar170._12_4_ = fVar124;
            auVar21 = vfmadd132ps_fma(auVar170,auVar21,*pauVar2);
            fVar124 = *(float *)((long)&local_1a0 + uVar100 * 4);
            fVar125 = auVar19._0_4_ * 0.5;
            auVar155._4_4_ = fVar125;
            auVar155._0_4_ = fVar125;
            auVar155._8_4_ = fVar125;
            auVar155._12_4_ = fVar125;
            auVar21 = vfmadd132ps_fma(auVar155,auVar21,*pauVar1);
            (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar100 * 4);
            uVar108 = vmovlps_avx(auVar21);
            *(undefined8 *)&(ray->Ng).field_0 = uVar108;
            fVar125 = (float)vextractps_avx(auVar21,2);
            (ray->Ng).field_0.field_0.z = fVar125;
            ray->u = fVar151;
            ray->v = fVar124;
            ray->primID = uVar99;
            ray->geomID = uVar97;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            prim = local_6c0;
          }
LAB_01173f1e:
          auVar149 = ZEXT3264(local_5a0);
          auVar176 = ZEXT3264(local_4a0);
          auVar166 = ZEXT3264(local_580);
          goto LAB_01173c3b;
        }
      }
      auVar166 = ZEXT3264(local_580);
      auVar176 = ZEXT3264(local_4a0);
      auVar149 = ZEXT3264(local_5a0);
      auVar240 = ZEXT3264(local_640);
      auVar215 = ZEXT3264(auVar225);
    }
LAB_01173c3b:
    auVar202 = ZEXT3264(CONCAT428(fStack_4e4,
                                  CONCAT424(fStack_4e8,
                                            CONCAT420(fStack_4ec,
                                                      CONCAT416(fStack_4f0,
                                                                CONCAT412(fStack_4f4,
                                                                          CONCAT48(fStack_4f8,
                                                                                   CONCAT44(
                                                  fStack_4fc,local_500))))))));
    if (8 < iVar14) {
      local_2e0._4_4_ = iVar14;
      local_2e0._0_4_ = iVar14;
      local_2e0._8_4_ = iVar14;
      local_2e0._12_4_ = iVar14;
      local_2e0._16_4_ = iVar14;
      local_2e0._20_4_ = iVar14;
      local_2e0._24_4_ = iVar14;
      local_2e0._28_4_ = iVar14;
      local_320._4_4_ = auVar233._0_4_;
      local_320._0_4_ = local_320._4_4_;
      local_320._8_4_ = local_320._4_4_;
      local_320._12_4_ = local_320._4_4_;
      local_320._16_4_ = local_320._4_4_;
      local_320._20_4_ = local_320._4_4_;
      local_320._24_4_ = local_320._4_4_;
      local_320._28_4_ = local_320._4_4_;
      local_120 = local_520._0_8_;
      uStack_118 = local_520._0_8_;
      uStack_110 = local_520._0_8_;
      uStack_108 = local_520._0_8_;
      local_140 = 1.0 / (float)local_3e0._0_4_;
      fStack_13c = local_140;
      fStack_138 = local_140;
      fStack_134 = local_140;
      fStack_130 = local_140;
      fStack_12c = local_140;
      fStack_128 = local_140;
      fStack_124 = local_140;
      lVar107 = 8;
      local_5e0 = auVar173;
      _local_5c0 = auVar231._0_32_;
      local_710 = lVar102;
LAB_01173fc2:
      local_5a0 = auVar149._0_32_;
      if (lVar107 < local_710) {
        auVar191 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar107 * 4 + lVar104);
        local_740 = *(undefined1 (*) [32])(lVar104 + 0x22047f0 + lVar107 * 4);
        auVar10 = *(undefined1 (*) [32])(lVar104 + 0x2204c74 + lVar107 * 4);
        pauVar5 = (undefined1 (*) [28])(lVar104 + 0x22050f8 + lVar107 * 4);
        fVar17 = *(float *)*pauVar5;
        fVar227 = *(float *)(*pauVar5 + 4);
        fVar72 = *(float *)(*pauVar5 + 8);
        fVar73 = *(float *)(*pauVar5 + 0xc);
        fVar74 = *(float *)(*pauVar5 + 0x10);
        fVar75 = *(float *)(*pauVar5 + 0x14);
        fVar76 = *(float *)(*pauVar5 + 0x18);
        auVar96 = *pauVar5;
        auVar232._0_4_ = fVar17 * auVar202._0_4_;
        auVar232._4_4_ = fVar227 * auVar202._4_4_;
        auVar232._8_4_ = fVar72 * auVar202._8_4_;
        auVar232._12_4_ = fVar73 * auVar202._12_4_;
        auVar232._16_4_ = fVar74 * auVar202._16_4_;
        auVar232._20_4_ = fVar75 * auVar202._20_4_;
        auVar232._28_36_ = auVar231._28_36_;
        auVar232._24_4_ = fVar76 * auVar202._24_4_;
        fVar208 = auVar215._0_4_;
        auVar150._0_4_ = fVar208 * fVar17;
        fVar216 = auVar215._4_4_;
        auVar150._4_4_ = fVar216 * fVar227;
        fVar217 = auVar215._8_4_;
        auVar150._8_4_ = fVar217 * fVar72;
        fVar218 = auVar215._12_4_;
        auVar150._12_4_ = fVar218 * fVar73;
        fVar219 = auVar215._16_4_;
        auVar150._16_4_ = fVar219 * fVar74;
        fVar220 = auVar215._20_4_;
        auVar150._20_4_ = fVar220 * fVar75;
        auVar150._28_36_ = auVar149._28_36_;
        fVar221 = auVar215._24_4_;
        auVar150._24_4_ = fVar221 * fVar76;
        auVar21 = vfmadd231ps_fma(auVar232._0_32_,auVar10,auVar176._0_32_);
        auVar18 = vfmadd231ps_fma(auVar150._0_32_,auVar10,auVar240._0_32_);
        auVar163 = auVar166._0_32_;
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_740,auVar163);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_740,local_3c0);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar191,auVar239._0_32_);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar191,local_440);
        auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar107 * 4 + lVar104);
        auVar164 = *(undefined1 (*) [32])(lVar104 + 0x2206c10 + lVar107 * 4);
        auVar161 = *(undefined1 (*) [32])(lVar104 + 0x2207094 + lVar107 * 4);
        pfVar6 = (float *)(lVar104 + 0x2207518 + lVar107 * 4);
        fVar77 = *pfVar6;
        fVar78 = pfVar6[1];
        fVar79 = pfVar6[2];
        fVar80 = pfVar6[3];
        fVar81 = pfVar6[4];
        fVar82 = pfVar6[5];
        fVar83 = pfVar6[6];
        auVar234._0_4_ = fVar77 * auVar202._0_4_;
        auVar234._4_4_ = fVar78 * auVar202._4_4_;
        auVar234._8_4_ = fVar79 * auVar202._8_4_;
        auVar234._12_4_ = fVar80 * auVar202._12_4_;
        auVar234._16_4_ = fVar81 * auVar202._16_4_;
        auVar234._20_4_ = fVar82 * auVar202._20_4_;
        auVar234._28_36_ = auVar233._28_36_;
        auVar234._24_4_ = fVar83 * auVar202._24_4_;
        auVar166._0_4_ = fVar208 * fVar77;
        auVar166._4_4_ = fVar216 * fVar78;
        auVar166._8_4_ = fVar217 * fVar79;
        auVar166._12_4_ = fVar218 * fVar80;
        auVar166._16_4_ = fVar219 * fVar81;
        auVar166._20_4_ = fVar220 * fVar82;
        auVar166._28_36_ = auVar202._28_36_;
        auVar166._24_4_ = fVar221 * fVar83;
        auVar114 = vfmadd231ps_fma(auVar234._0_32_,auVar161,auVar176._0_32_);
        auVar19 = vfmadd231ps_fma(auVar166._0_32_,auVar161,auVar240._0_32_);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar164,auVar163);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar164,local_3c0);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar115,auVar239._0_32_);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar115,local_440);
        local_4c0 = ZEXT1632(auVar114);
        local_4e0 = ZEXT1632(auVar21);
        auVar120 = vsubps_avx(local_4c0,local_4e0);
        local_520 = ZEXT1632(auVar19);
        auVar117 = ZEXT1632(auVar18);
        local_400 = vsubps_avx(local_520,auVar117);
        auVar44._4_4_ = auVar18._4_4_ * auVar120._4_4_;
        auVar44._0_4_ = auVar18._0_4_ * auVar120._0_4_;
        auVar44._8_4_ = auVar18._8_4_ * auVar120._8_4_;
        auVar44._12_4_ = auVar18._12_4_ * auVar120._12_4_;
        auVar44._16_4_ = auVar120._16_4_ * 0.0;
        auVar44._20_4_ = auVar120._20_4_ * 0.0;
        auVar44._24_4_ = auVar120._24_4_ * 0.0;
        auVar44._28_4_ = local_3c0._28_4_;
        fVar151 = local_400._0_4_;
        auVar144._0_4_ = auVar21._0_4_ * fVar151;
        fVar124 = local_400._4_4_;
        auVar144._4_4_ = auVar21._4_4_ * fVar124;
        fVar125 = local_400._8_4_;
        auVar144._8_4_ = auVar21._8_4_ * fVar125;
        fVar126 = local_400._12_4_;
        auVar144._12_4_ = auVar21._12_4_ * fVar126;
        fVar127 = local_400._16_4_;
        auVar144._16_4_ = fVar127 * 0.0;
        fVar128 = local_400._20_4_;
        auVar144._20_4_ = fVar128 * 0.0;
        fVar129 = local_400._24_4_;
        auVar144._24_4_ = fVar129 * 0.0;
        auVar144._28_4_ = 0;
        auVar16 = vsubps_avx(auVar44,auVar144);
        auVar199._0_4_ = (float)local_e0 * fVar17;
        auVar199._4_4_ = local_e0._4_4_ * fVar227;
        auVar199._8_4_ = (float)uStack_d8 * fVar72;
        auVar199._12_4_ = uStack_d8._4_4_ * fVar73;
        auVar199._16_4_ = (float)uStack_d0 * fVar74;
        auVar199._20_4_ = uStack_d0._4_4_ * fVar75;
        auVar199._24_4_ = (float)uStack_c8 * fVar76;
        auVar199._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar199,auVar10,local_c0);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,local_740);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_80,auVar191);
        auVar45._4_4_ = local_e0._4_4_ * fVar78;
        auVar45._0_4_ = (float)local_e0 * fVar77;
        auVar45._8_4_ = (float)uStack_d8 * fVar79;
        auVar45._12_4_ = uStack_d8._4_4_ * fVar80;
        auVar45._16_4_ = (float)uStack_d0 * fVar81;
        auVar45._20_4_ = uStack_d0._4_4_ * fVar82;
        auVar45._24_4_ = (float)uStack_c8 * fVar83;
        auVar45._28_4_ = uStack_c8._4_4_;
        auVar18 = vfmadd231ps_fma(auVar45,auVar161,local_c0);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar164,local_a0);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar115,local_80);
        auVar233 = ZEXT1664(auVar18);
        auVar239._0_4_ = fVar151 * fVar151;
        auVar239._4_4_ = fVar124 * fVar124;
        auVar239._8_4_ = fVar125 * fVar125;
        auVar239._12_4_ = fVar126 * fVar126;
        auVar239._16_4_ = fVar127 * fVar127;
        auVar239._20_4_ = fVar128 * fVar128;
        auVar239._28_36_ = auVar215._28_36_;
        auVar239._24_4_ = fVar129 * fVar129;
        auVar231 = ZEXT3264(auVar120);
        auVar114 = vfmadd231ps_fma(auVar239._0_32_,auVar120,auVar120);
        local_540 = ZEXT1632(auVar18);
        auVar11 = vmaxps_avx(ZEXT1632(auVar21),local_540);
        auVar212._0_4_ = auVar11._0_4_ * auVar11._0_4_ * auVar114._0_4_;
        auVar212._4_4_ = auVar11._4_4_ * auVar11._4_4_ * auVar114._4_4_;
        auVar212._8_4_ = auVar11._8_4_ * auVar11._8_4_ * auVar114._8_4_;
        auVar212._12_4_ = auVar11._12_4_ * auVar11._12_4_ * auVar114._12_4_;
        auVar212._16_4_ = auVar11._16_4_ * auVar11._16_4_ * 0.0;
        auVar212._20_4_ = auVar11._20_4_ * auVar11._20_4_ * 0.0;
        auVar212._24_4_ = auVar11._24_4_ * auVar11._24_4_ * 0.0;
        auVar212._28_4_ = 0;
        auVar46._4_4_ = auVar16._4_4_ * auVar16._4_4_;
        auVar46._0_4_ = auVar16._0_4_ * auVar16._0_4_;
        auVar46._8_4_ = auVar16._8_4_ * auVar16._8_4_;
        auVar46._12_4_ = auVar16._12_4_ * auVar16._12_4_;
        auVar46._16_4_ = auVar16._16_4_ * auVar16._16_4_;
        auVar46._20_4_ = auVar16._20_4_ * auVar16._20_4_;
        auVar46._24_4_ = auVar16._24_4_ * auVar16._24_4_;
        auVar46._28_4_ = auVar16._28_4_;
        auVar11 = vcmpps_avx(auVar46,auVar212,2);
        local_240 = (int)lVar107;
        auVar213._4_4_ = local_240;
        auVar213._0_4_ = local_240;
        auVar213._8_4_ = local_240;
        auVar213._12_4_ = local_240;
        auVar213._16_4_ = local_240;
        auVar213._20_4_ = local_240;
        auVar213._24_4_ = local_240;
        auVar213._28_4_ = local_240;
        auVar16 = vpor_avx2(auVar213,_DAT_01fb4ba0);
        auVar22 = vpcmpgtd_avx2(local_2e0,auVar16);
        auVar16 = auVar22 & auVar11;
        if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar16 >> 0x7f,0) != '\0') ||
              (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0xbf,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar16[0x1f] < '\0') {
          local_3e0 = vandps_avx(auVar22,auVar11);
          auVar47._4_4_ = (float)local_5c0._4_4_ * fVar78;
          auVar47._0_4_ = (float)local_5c0._0_4_ * fVar77;
          auVar47._8_4_ = fStack_5b8 * fVar79;
          auVar47._12_4_ = fStack_5b4 * fVar80;
          auVar47._16_4_ = fStack_5b0 * fVar81;
          auVar47._20_4_ = fStack_5ac * fVar82;
          auVar47._24_4_ = fStack_5a8 * fVar83;
          auVar47._28_4_ = auVar11._28_4_;
          auVar18 = vfmadd213ps_fma(auVar161,local_660,auVar47);
          auVar18 = vfmadd213ps_fma(auVar164,local_100,ZEXT1632(auVar18));
          auVar18 = vfmadd213ps_fma(auVar115,local_5e0,ZEXT1632(auVar18));
          local_300 = ZEXT1632(auVar18);
          local_420._0_4_ = auVar96._0_4_;
          local_420._4_4_ = auVar96._4_4_;
          fStack_418 = auVar96._8_4_;
          fStack_414 = auVar96._12_4_;
          fStack_410 = auVar96._16_4_;
          fStack_40c = auVar96._20_4_;
          fStack_408 = auVar96._24_4_;
          auVar48._4_4_ = (float)local_5c0._4_4_ * (float)local_420._4_4_;
          auVar48._0_4_ = (float)local_5c0._0_4_ * (float)local_420._0_4_;
          auVar48._8_4_ = fStack_5b8 * fStack_418;
          auVar48._12_4_ = fStack_5b4 * fStack_414;
          auVar48._16_4_ = fStack_5b0 * fStack_410;
          auVar48._20_4_ = fStack_5ac * fStack_40c;
          auVar48._24_4_ = fStack_5a8 * fStack_408;
          auVar48._28_4_ = auVar11._28_4_;
          auVar18 = vfmadd213ps_fma(auVar10,local_660,auVar48);
          auVar18 = vfmadd213ps_fma(local_740,local_100,ZEXT1632(auVar18));
          auVar10 = *(undefined1 (*) [32])(lVar104 + 0x220557c + lVar107 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar104 + 0x2205a00 + lVar107 * 4);
          auVar164 = *(undefined1 (*) [32])(lVar104 + 0x2205e84 + lVar107 * 4);
          pfVar6 = (float *)(lVar104 + 0x2206308 + lVar107 * 4);
          fVar151 = *pfVar6;
          fVar124 = pfVar6[1];
          fVar125 = pfVar6[2];
          fVar126 = pfVar6[3];
          fVar127 = pfVar6[4];
          fVar128 = pfVar6[5];
          fVar129 = pfVar6[6];
          _local_420 = auVar120;
          auVar207._0_4_ = local_500 * fVar151;
          auVar207._4_4_ = fStack_4fc * fVar124;
          auVar207._8_4_ = fStack_4f8 * fVar125;
          auVar207._12_4_ = fStack_4f4 * fVar126;
          auVar207._16_4_ = fStack_4f0 * fVar127;
          auVar207._20_4_ = fStack_4ec * fVar128;
          auVar207._24_4_ = fStack_4e8 * fVar129;
          auVar207._28_4_ = 0;
          auVar49._4_4_ = fVar124 * fVar216;
          auVar49._0_4_ = fVar151 * fVar208;
          auVar49._8_4_ = fVar125 * fVar217;
          auVar49._12_4_ = fVar126 * fVar218;
          auVar49._16_4_ = fVar127 * fVar219;
          auVar49._20_4_ = fVar128 * fVar220;
          auVar49._24_4_ = fVar129 * fVar221;
          auVar49._28_4_ = auVar120._28_4_;
          auVar50._4_4_ = (float)local_5c0._4_4_ * fVar124;
          auVar50._0_4_ = (float)local_5c0._0_4_ * fVar151;
          auVar50._8_4_ = fStack_5b8 * fVar125;
          auVar50._12_4_ = fStack_5b4 * fVar126;
          auVar50._16_4_ = fStack_5b0 * fVar127;
          auVar50._20_4_ = fStack_5ac * fVar128;
          auVar50._24_4_ = fStack_5a8 * fVar129;
          auVar50._28_4_ = pfVar6[7];
          auVar114 = vfmadd231ps_fma(auVar207,auVar164,local_4a0);
          auVar19 = vfmadd231ps_fma(auVar49,auVar164,local_640);
          auVar133 = vfmadd231ps_fma(auVar50,local_660,auVar164);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar115,local_580);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar115,local_3c0);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_100,auVar115);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar10,local_680);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar10,local_440);
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_5e0,auVar10);
          pfVar6 = (float *)(lVar104 + 0x2208728 + lVar107 * 4);
          fVar151 = *pfVar6;
          fVar124 = pfVar6[1];
          fVar125 = pfVar6[2];
          fVar126 = pfVar6[3];
          fVar127 = pfVar6[4];
          fVar128 = pfVar6[5];
          fVar129 = pfVar6[6];
          auVar51._4_4_ = fStack_4fc * fVar124;
          auVar51._0_4_ = local_500 * fVar151;
          auVar51._8_4_ = fStack_4f8 * fVar125;
          auVar51._12_4_ = fStack_4f4 * fVar126;
          auVar51._16_4_ = fStack_4f0 * fVar127;
          auVar51._20_4_ = fStack_4ec * fVar128;
          auVar51._24_4_ = fStack_4e8 * fVar129;
          auVar51._28_4_ = fStack_4e4;
          auVar52._4_4_ = fVar216 * fVar124;
          auVar52._0_4_ = fVar208 * fVar151;
          auVar52._8_4_ = fVar217 * fVar125;
          auVar52._12_4_ = fVar218 * fVar126;
          auVar52._16_4_ = fVar219 * fVar127;
          auVar52._20_4_ = fVar220 * fVar128;
          auVar52._24_4_ = fVar221 * fVar129;
          auVar52._28_4_ = local_5e0._28_4_;
          auVar53._4_4_ = fVar124 * (float)local_5c0._4_4_;
          auVar53._0_4_ = fVar151 * (float)local_5c0._0_4_;
          auVar53._8_4_ = fVar125 * fStack_5b8;
          auVar53._12_4_ = fVar126 * fStack_5b4;
          auVar53._16_4_ = fVar127 * fStack_5b0;
          auVar53._20_4_ = fVar128 * fStack_5ac;
          auVar53._24_4_ = fVar129 * fStack_5a8;
          auVar53._28_4_ = pfVar6[7];
          auVar10 = *(undefined1 (*) [32])(lVar104 + 0x22082a4 + lVar107 * 4);
          auVar20 = vfmadd231ps_fma(auVar51,auVar10,local_4a0);
          auVar112 = vfmadd231ps_fma(auVar52,auVar10,local_640);
          auVar111 = vfmadd231ps_fma(auVar53,auVar10,local_660);
          auVar10 = *(undefined1 (*) [32])(lVar104 + 0x2207e20 + lVar107 * 4);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,local_580);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar10,local_3c0);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_100,auVar10);
          auVar10 = *(undefined1 (*) [32])(lVar104 + 0x220799c + lVar107 * 4);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,local_680);
          auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar10,local_440);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_5e0,auVar10);
          auVar214._8_4_ = 0x7fffffff;
          auVar214._0_8_ = 0x7fffffff7fffffff;
          auVar214._12_4_ = 0x7fffffff;
          auVar214._16_4_ = 0x7fffffff;
          auVar214._20_4_ = 0x7fffffff;
          auVar214._24_4_ = 0x7fffffff;
          auVar214._28_4_ = 0x7fffffff;
          auVar10 = vandps_avx(ZEXT1632(auVar114),auVar214);
          auVar115 = vandps_avx(ZEXT1632(auVar19),auVar214);
          auVar115 = vmaxps_avx(auVar10,auVar115);
          auVar10 = vandps_avx(ZEXT1632(auVar133),auVar214);
          auVar10 = vmaxps_avx(auVar115,auVar10);
          auVar10 = vcmpps_avx(auVar10,local_320,1);
          auVar164 = vblendvps_avx(ZEXT1632(auVar114),auVar120,auVar10);
          auVar161 = vblendvps_avx(ZEXT1632(auVar19),local_400,auVar10);
          auVar10 = vandps_avx(ZEXT1632(auVar20),auVar214);
          auVar115 = vandps_avx(ZEXT1632(auVar112),auVar214);
          auVar115 = vmaxps_avx(auVar10,auVar115);
          auVar10 = vandps_avx(auVar214,ZEXT1632(auVar111));
          auVar10 = vmaxps_avx(auVar115,auVar10);
          auVar115 = vcmpps_avx(auVar10,local_320,1);
          auVar10 = vblendvps_avx(ZEXT1632(auVar20),auVar120,auVar115);
          auVar115 = vblendvps_avx(ZEXT1632(auVar112),local_400,auVar115);
          auVar18 = vfmadd213ps_fma(auVar191,local_5e0,ZEXT1632(auVar18));
          auVar114 = vfmadd213ps_fma(auVar164,auVar164,ZEXT832(0) << 0x20);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar161,auVar161);
          auVar191 = vrsqrtps_avx(ZEXT1632(auVar114));
          fVar151 = auVar191._0_4_;
          fVar124 = auVar191._4_4_;
          fVar125 = auVar191._8_4_;
          fVar126 = auVar191._12_4_;
          fVar127 = auVar191._16_4_;
          fVar128 = auVar191._20_4_;
          fVar129 = auVar191._24_4_;
          auVar54._4_4_ = fVar124 * fVar124 * fVar124 * auVar114._4_4_ * -0.5;
          auVar54._0_4_ = fVar151 * fVar151 * fVar151 * auVar114._0_4_ * -0.5;
          auVar54._8_4_ = fVar125 * fVar125 * fVar125 * auVar114._8_4_ * -0.5;
          auVar54._12_4_ = fVar126 * fVar126 * fVar126 * auVar114._12_4_ * -0.5;
          auVar54._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar54._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar54._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar54._28_4_ = 0;
          auVar238._8_4_ = 0x3fc00000;
          auVar238._0_8_ = 0x3fc000003fc00000;
          auVar238._12_4_ = 0x3fc00000;
          auVar238._16_4_ = 0x3fc00000;
          auVar238._20_4_ = 0x3fc00000;
          auVar238._24_4_ = 0x3fc00000;
          auVar238._28_4_ = 0x3fc00000;
          auVar114 = vfmadd231ps_fma(auVar54,auVar238,auVar191);
          fVar151 = auVar114._0_4_;
          fVar124 = auVar114._4_4_;
          auVar55._4_4_ = auVar161._4_4_ * fVar124;
          auVar55._0_4_ = auVar161._0_4_ * fVar151;
          fVar125 = auVar114._8_4_;
          auVar55._8_4_ = auVar161._8_4_ * fVar125;
          fVar126 = auVar114._12_4_;
          auVar55._12_4_ = auVar161._12_4_ * fVar126;
          auVar55._16_4_ = auVar161._16_4_ * 0.0;
          auVar55._20_4_ = auVar161._20_4_ * 0.0;
          auVar55._24_4_ = auVar161._24_4_ * 0.0;
          auVar55._28_4_ = auVar191._28_4_;
          auVar56._4_4_ = fVar124 * -auVar164._4_4_;
          auVar56._0_4_ = fVar151 * -auVar164._0_4_;
          auVar56._8_4_ = fVar125 * -auVar164._8_4_;
          auVar56._12_4_ = fVar126 * -auVar164._12_4_;
          auVar56._16_4_ = -auVar164._16_4_ * 0.0;
          auVar56._20_4_ = -auVar164._20_4_ * 0.0;
          auVar56._24_4_ = -auVar164._24_4_ * 0.0;
          auVar56._28_4_ = auVar161._28_4_;
          auVar114 = vfmadd213ps_fma(auVar10,auVar10,ZEXT832(0) << 0x20);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar115,auVar115);
          auVar191 = vrsqrtps_avx(ZEXT1632(auVar114));
          auVar57._28_4_ = local_640._28_4_;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * 0.0,
                                  CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar151 * 0.0))));
          fVar151 = auVar191._0_4_;
          fVar124 = auVar191._4_4_;
          fVar125 = auVar191._8_4_;
          fVar126 = auVar191._12_4_;
          fVar127 = auVar191._16_4_;
          fVar128 = auVar191._20_4_;
          fVar129 = auVar191._24_4_;
          auVar58._4_4_ = fVar124 * fVar124 * fVar124 * auVar114._4_4_ * -0.5;
          auVar58._0_4_ = fVar151 * fVar151 * fVar151 * auVar114._0_4_ * -0.5;
          auVar58._8_4_ = fVar125 * fVar125 * fVar125 * auVar114._8_4_ * -0.5;
          auVar58._12_4_ = fVar126 * fVar126 * fVar126 * auVar114._12_4_ * -0.5;
          auVar58._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
          auVar58._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
          auVar58._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
          auVar58._28_4_ = 0;
          auVar114 = vfmadd231ps_fma(auVar58,auVar238,auVar191);
          fVar151 = auVar114._0_4_;
          fVar124 = auVar114._4_4_;
          auVar59._4_4_ = auVar115._4_4_ * fVar124;
          auVar59._0_4_ = auVar115._0_4_ * fVar151;
          fVar125 = auVar114._8_4_;
          auVar59._8_4_ = auVar115._8_4_ * fVar125;
          fVar126 = auVar114._12_4_;
          auVar59._12_4_ = auVar115._12_4_ * fVar126;
          auVar59._16_4_ = auVar115._16_4_ * 0.0;
          auVar59._20_4_ = auVar115._20_4_ * 0.0;
          auVar59._24_4_ = auVar115._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar60._4_4_ = fVar124 * -auVar10._4_4_;
          auVar60._0_4_ = fVar151 * -auVar10._0_4_;
          auVar60._8_4_ = fVar125 * -auVar10._8_4_;
          auVar60._12_4_ = fVar126 * -auVar10._12_4_;
          auVar60._16_4_ = -auVar10._16_4_ * 0.0;
          auVar60._20_4_ = -auVar10._20_4_ * 0.0;
          auVar60._24_4_ = -auVar10._24_4_ * 0.0;
          auVar60._28_4_ = auVar191._28_4_;
          auVar61._28_4_ = 0xbf000000;
          auVar61._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * 0.0,
                                  CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar151 * 0.0))));
          auVar114 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar21),local_4e0);
          auVar191 = ZEXT1632(auVar21);
          auVar19 = vfmadd213ps_fma(auVar56,auVar191,auVar117);
          auVar133 = vfmadd213ps_fma(auVar57,auVar191,ZEXT1632(auVar18));
          auVar152 = vfnmadd213ps_fma(auVar55,auVar191,local_4e0);
          auVar20 = vfmadd213ps_fma(auVar59,local_540,local_4c0);
          auVar132 = vfnmadd213ps_fma(auVar56,auVar191,auVar117);
          auVar112 = vfmadd213ps_fma(auVar60,local_540,local_520);
          local_740 = ZEXT1632(auVar21);
          auVar21 = vfnmadd231ps_fma(ZEXT1632(auVar18),local_740,auVar57);
          auVar18 = vfmadd213ps_fma(auVar61,local_540,local_300);
          auVar110 = vfnmadd213ps_fma(auVar59,local_540,local_4c0);
          auVar153 = vfnmadd213ps_fma(auVar60,local_540,local_520);
          auVar167 = vfnmadd231ps_fma(local_300,local_540,auVar61);
          auVar191 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar132));
          auVar10 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar21));
          auVar200._0_4_ = auVar191._0_4_ * auVar21._0_4_;
          auVar200._4_4_ = auVar191._4_4_ * auVar21._4_4_;
          auVar200._8_4_ = auVar191._8_4_ * auVar21._8_4_;
          auVar200._12_4_ = auVar191._12_4_ * auVar21._12_4_;
          auVar200._16_4_ = auVar191._16_4_ * 0.0;
          auVar200._20_4_ = auVar191._20_4_ * 0.0;
          auVar200._24_4_ = auVar191._24_4_ * 0.0;
          auVar200._28_4_ = 0;
          auVar111 = vfmsub231ps_fma(auVar200,ZEXT1632(auVar132),auVar10);
          auVar62._4_4_ = auVar152._4_4_ * auVar10._4_4_;
          auVar62._0_4_ = auVar152._0_4_ * auVar10._0_4_;
          auVar62._8_4_ = auVar152._8_4_ * auVar10._8_4_;
          auVar62._12_4_ = auVar152._12_4_ * auVar10._12_4_;
          auVar62._16_4_ = auVar10._16_4_ * 0.0;
          auVar62._20_4_ = auVar10._20_4_ * 0.0;
          auVar62._24_4_ = auVar10._24_4_ * 0.0;
          auVar62._28_4_ = auVar10._28_4_;
          auVar161 = ZEXT1632(auVar152);
          auVar10 = vsubps_avx(ZEXT1632(auVar20),auVar161);
          auVar120 = ZEXT1632(auVar21);
          auVar21 = vfmsub231ps_fma(auVar62,auVar120,auVar10);
          auVar63._4_4_ = auVar132._4_4_ * auVar10._4_4_;
          auVar63._0_4_ = auVar132._0_4_ * auVar10._0_4_;
          auVar63._8_4_ = auVar132._8_4_ * auVar10._8_4_;
          auVar63._12_4_ = auVar132._12_4_ * auVar10._12_4_;
          auVar63._16_4_ = auVar10._16_4_ * 0.0;
          auVar63._20_4_ = auVar10._20_4_ * 0.0;
          auVar63._24_4_ = auVar10._24_4_ * 0.0;
          auVar63._28_4_ = auVar10._28_4_;
          auVar152 = vfmsub231ps_fma(auVar63,auVar161,auVar191);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar152),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar111));
          auVar16 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
          local_780 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar114),auVar16);
          local_520 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar19),auVar16);
          auVar191 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar133),auVar16);
          auVar231 = ZEXT3264(auVar191);
          auVar10 = vblendvps_avx(auVar161,ZEXT1632(auVar20),auVar16);
          auVar115 = vblendvps_avx(ZEXT1632(auVar132),ZEXT1632(auVar112),auVar16);
          auVar164 = vblendvps_avx(auVar120,ZEXT1632(auVar18),auVar16);
          auVar161 = vblendvps_avx(ZEXT1632(auVar20),auVar161,auVar16);
          auVar11 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar132),auVar16);
          auVar21 = vpackssdw_avx(local_3e0._0_16_,local_3e0._16_16_);
          local_760 = ZEXT1632(auVar21);
          auVar120 = vblendvps_avx(ZEXT1632(auVar18),auVar120,auVar16);
          auVar161 = vsubps_avx(auVar161,local_780);
          auVar11 = vsubps_avx(auVar11,local_520);
          auVar22 = vsubps_avx(auVar120,auVar191);
          auVar117 = vsubps_avx(local_780,auVar10);
          auVar163 = vsubps_avx(local_520,auVar115);
          auVar24 = vsubps_avx(auVar191,auVar164);
          auVar192._0_4_ = auVar22._0_4_ * local_780._0_4_;
          auVar192._4_4_ = auVar22._4_4_ * local_780._4_4_;
          auVar192._8_4_ = auVar22._8_4_ * local_780._8_4_;
          auVar192._12_4_ = auVar22._12_4_ * local_780._12_4_;
          auVar192._16_4_ = auVar22._16_4_ * local_780._16_4_;
          auVar192._20_4_ = auVar22._20_4_ * local_780._20_4_;
          auVar192._24_4_ = auVar22._24_4_ * local_780._24_4_;
          auVar192._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar192,auVar191,auVar161);
          auVar64._4_4_ = auVar161._4_4_ * local_520._4_4_;
          auVar64._0_4_ = auVar161._0_4_ * local_520._0_4_;
          auVar64._8_4_ = auVar161._8_4_ * local_520._8_4_;
          auVar64._12_4_ = auVar161._12_4_ * local_520._12_4_;
          auVar64._16_4_ = auVar161._16_4_ * local_520._16_4_;
          auVar64._20_4_ = auVar161._20_4_ * local_520._20_4_;
          auVar64._24_4_ = auVar161._24_4_ * local_520._24_4_;
          auVar64._28_4_ = auVar120._28_4_;
          auVar114 = vfmsub231ps_fma(auVar64,local_780,auVar11);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar193._0_4_ = auVar191._0_4_ * auVar11._0_4_;
          auVar193._4_4_ = auVar191._4_4_ * auVar11._4_4_;
          auVar193._8_4_ = auVar191._8_4_ * auVar11._8_4_;
          auVar193._12_4_ = auVar191._12_4_ * auVar11._12_4_;
          auVar193._16_4_ = auVar191._16_4_ * auVar11._16_4_;
          auVar193._20_4_ = auVar191._20_4_ * auVar11._20_4_;
          auVar193._24_4_ = auVar191._24_4_ * auVar11._24_4_;
          auVar193._28_4_ = 0;
          auVar114 = vfmsub231ps_fma(auVar193,local_520,auVar22);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
          auVar194._0_4_ = auVar24._0_4_ * auVar10._0_4_;
          auVar194._4_4_ = auVar24._4_4_ * auVar10._4_4_;
          auVar194._8_4_ = auVar24._8_4_ * auVar10._8_4_;
          auVar194._12_4_ = auVar24._12_4_ * auVar10._12_4_;
          auVar194._16_4_ = auVar24._16_4_ * auVar10._16_4_;
          auVar194._20_4_ = auVar24._20_4_ * auVar10._20_4_;
          auVar194._24_4_ = auVar24._24_4_ * auVar10._24_4_;
          auVar194._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar194,auVar117,auVar164);
          auVar65._4_4_ = auVar163._4_4_ * auVar164._4_4_;
          auVar65._0_4_ = auVar163._0_4_ * auVar164._0_4_;
          auVar65._8_4_ = auVar163._8_4_ * auVar164._8_4_;
          auVar65._12_4_ = auVar163._12_4_ * auVar164._12_4_;
          auVar65._16_4_ = auVar163._16_4_ * auVar164._16_4_;
          auVar65._20_4_ = auVar163._20_4_ * auVar164._20_4_;
          auVar65._24_4_ = auVar163._24_4_ * auVar164._24_4_;
          auVar65._28_4_ = auVar164._28_4_;
          auVar19 = vfmsub231ps_fma(auVar65,auVar115,auVar24);
          auVar66._4_4_ = auVar117._4_4_ * auVar115._4_4_;
          auVar66._0_4_ = auVar117._0_4_ * auVar115._0_4_;
          auVar66._8_4_ = auVar117._8_4_ * auVar115._8_4_;
          auVar66._12_4_ = auVar117._12_4_ * auVar115._12_4_;
          auVar66._16_4_ = auVar117._16_4_ * auVar115._16_4_;
          auVar66._20_4_ = auVar117._20_4_ * auVar115._20_4_;
          auVar66._24_4_ = auVar117._24_4_ * auVar115._24_4_;
          auVar66._28_4_ = auVar115._28_4_;
          auVar133 = vfmsub231ps_fma(auVar66,auVar163,auVar10);
          auVar115 = ZEXT832(0) << 0x20;
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar115,ZEXT1632(auVar18));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar115,ZEXT1632(auVar19));
          auVar10 = vmaxps_avx(ZEXT1632(auVar114),ZEXT1632(auVar19));
          auVar10 = vcmpps_avx(auVar10,auVar115,2);
          auVar18 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          auVar21 = vpand_avx(auVar18,auVar21);
          auVar10 = vpmovsxwd_avx2(auVar21);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
LAB_01174ac1:
            auVar175._8_8_ = local_480[1]._8_8_;
            auVar175._0_8_ = local_480[1]._0_8_;
            auVar175._16_8_ = local_480[1]._16_8_;
            auVar175._24_8_ = local_480[1]._24_8_;
          }
          else {
            auVar67._4_4_ = auVar24._4_4_ * auVar11._4_4_;
            auVar67._0_4_ = auVar24._0_4_ * auVar11._0_4_;
            auVar67._8_4_ = auVar24._8_4_ * auVar11._8_4_;
            auVar67._12_4_ = auVar24._12_4_ * auVar11._12_4_;
            auVar67._16_4_ = auVar24._16_4_ * auVar11._16_4_;
            auVar67._20_4_ = auVar24._20_4_ * auVar11._20_4_;
            auVar67._24_4_ = auVar24._24_4_ * auVar11._24_4_;
            auVar67._28_4_ = auVar10._28_4_;
            auVar112 = vfmsub231ps_fma(auVar67,auVar163,auVar22);
            auVar201._0_4_ = auVar22._0_4_ * auVar117._0_4_;
            auVar201._4_4_ = auVar22._4_4_ * auVar117._4_4_;
            auVar201._8_4_ = auVar22._8_4_ * auVar117._8_4_;
            auVar201._12_4_ = auVar22._12_4_ * auVar117._12_4_;
            auVar201._16_4_ = auVar22._16_4_ * auVar117._16_4_;
            auVar201._20_4_ = auVar22._20_4_ * auVar117._20_4_;
            auVar201._24_4_ = auVar22._24_4_ * auVar117._24_4_;
            auVar201._28_4_ = 0;
            auVar20 = vfmsub231ps_fma(auVar201,auVar161,auVar24);
            auVar68._4_4_ = auVar161._4_4_ * auVar163._4_4_;
            auVar68._0_4_ = auVar161._0_4_ * auVar163._0_4_;
            auVar68._8_4_ = auVar161._8_4_ * auVar163._8_4_;
            auVar68._12_4_ = auVar161._12_4_ * auVar163._12_4_;
            auVar68._16_4_ = auVar161._16_4_ * auVar163._16_4_;
            auVar68._20_4_ = auVar161._20_4_ * auVar163._20_4_;
            auVar68._24_4_ = auVar161._24_4_ * auVar163._24_4_;
            auVar68._28_4_ = auVar163._28_4_;
            auVar111 = vfmsub231ps_fma(auVar68,auVar117,auVar11);
            auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar111));
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar112),auVar115);
            auVar10 = vrcpps_avx(ZEXT1632(auVar133));
            auVar230._8_4_ = 0x3f800000;
            auVar230._0_8_ = 0x3f8000003f800000;
            auVar230._12_4_ = 0x3f800000;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar231 = ZEXT3264(auVar230);
            auVar18 = vfnmadd213ps_fma(auVar10,ZEXT1632(auVar133),auVar230);
            auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar10,auVar10);
            auVar69._4_4_ = auVar111._4_4_ * auVar191._4_4_;
            auVar69._0_4_ = auVar111._0_4_ * auVar191._0_4_;
            auVar69._8_4_ = auVar111._8_4_ * auVar191._8_4_;
            auVar69._12_4_ = auVar111._12_4_ * auVar191._12_4_;
            auVar69._16_4_ = auVar191._16_4_ * 0.0;
            auVar69._20_4_ = auVar191._20_4_ * 0.0;
            auVar69._24_4_ = auVar191._24_4_ * 0.0;
            auVar69._28_4_ = auVar191._28_4_;
            auVar20 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar20),local_520);
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar112),local_780);
            fVar124 = auVar18._0_4_;
            fVar125 = auVar18._4_4_;
            fVar126 = auVar18._8_4_;
            fVar127 = auVar18._12_4_;
            auVar115 = ZEXT1632(CONCAT412(auVar20._12_4_ * fVar127,
                                          CONCAT48(auVar20._8_4_ * fVar126,
                                                   CONCAT44(auVar20._4_4_ * fVar125,
                                                            auVar20._0_4_ * fVar124))));
            fVar151 = (ray->super_RayK<1>).tfar;
            auVar174._4_4_ = fVar151;
            auVar174._0_4_ = fVar151;
            auVar174._8_4_ = fVar151;
            auVar174._12_4_ = fVar151;
            auVar174._16_4_ = fVar151;
            auVar174._20_4_ = fVar151;
            auVar174._24_4_ = fVar151;
            auVar174._28_4_ = fVar151;
            auVar95._8_8_ = uStack_118;
            auVar95._0_8_ = local_120;
            auVar95._16_8_ = uStack_110;
            auVar95._24_8_ = uStack_108;
            auVar191 = vcmpps_avx(auVar95,auVar115,2);
            auVar10 = vcmpps_avx(auVar115,auVar174,2);
            auVar191 = vandps_avx(auVar10,auVar191);
            auVar18 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
            auVar21 = vpand_avx(auVar21,auVar18);
            auVar191 = vpmovsxwd_avx2(auVar21);
            if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar191 >> 0x7f,0) == '\0') &&
                  (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar191 >> 0xbf,0) == '\0') &&
                (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar191[0x1f]) goto LAB_01174ac1;
            auVar191 = vcmpps_avx(ZEXT1632(auVar133),ZEXT832(0) << 0x20,4);
            auVar18 = vpackssdw_avx(auVar191._0_16_,auVar191._16_16_);
            auVar21 = vpand_avx(auVar21,auVar18);
            auVar191 = vpmovsxwd_avx2(auVar21);
            auVar175._8_8_ = local_480[1]._8_8_;
            auVar175._0_8_ = local_480[1]._0_8_;
            auVar175._16_8_ = local_480[1]._16_8_;
            auVar175._24_8_ = local_480[1]._24_8_;
            if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar191 >> 0x7f,0) != '\0') ||
                  (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar191 >> 0xbf,0) != '\0') ||
                (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar191[0x1f] < '\0') {
              auVar164 = ZEXT1632(CONCAT412(auVar114._12_4_ * fVar127,
                                            CONCAT48(auVar114._8_4_ * fVar126,
                                                     CONCAT44(auVar114._4_4_ * fVar125,
                                                              auVar114._0_4_ * fVar124))));
              auVar70._28_4_ = SUB84(local_480[1]._24_8_,4);
              auVar70._0_28_ =
                   ZEXT1628(CONCAT412(auVar19._12_4_ * fVar127,
                                      CONCAT48(auVar19._8_4_ * fVar126,
                                               CONCAT44(auVar19._4_4_ * fVar125,
                                                        auVar19._0_4_ * fVar124))));
              auVar121._8_4_ = 0x3f800000;
              auVar121._0_8_ = 0x3f8000003f800000;
              auVar121._12_4_ = 0x3f800000;
              auVar121._16_4_ = 0x3f800000;
              auVar121._20_4_ = 0x3f800000;
              auVar121._24_4_ = 0x3f800000;
              auVar121._28_4_ = 0x3f800000;
              auVar10 = vsubps_avx(auVar121,auVar164);
              local_5a0 = vblendvps_avx(auVar10,auVar164,auVar16);
              auVar10 = vsubps_avx(auVar121,auVar70);
              local_3a0 = vblendvps_avx(auVar10,auVar70,auVar16);
              local_380 = auVar115;
              auVar175 = auVar191;
            }
          }
          auVar240 = ZEXT3264(local_640);
          auVar239 = ZEXT3264(local_680);
          auVar233 = ZEXT3264(local_540);
          auVar215 = ZEXT3264(CONCAT428(fStack_544,
                                        CONCAT424(fStack_548,
                                                  CONCAT420(fStack_54c,
                                                            CONCAT416(fStack_550,
                                                                      CONCAT412(fStack_554,
                                                                                CONCAT48(fStack_558,
                                                                                         CONCAT44(
                                                  fStack_55c,local_560))))))));
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar175 >> 0x7f,0) == '\0') &&
                (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar175 >> 0xbf,0) == '\0') &&
              (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar175[0x1f]) goto LAB_01174788;
          auVar191 = vsubps_avx(local_540,local_740);
          auVar21 = vfmadd213ps_fma(auVar191,local_5a0,local_740);
          fVar151 = pre->depth_scale;
          auVar71._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar151;
          auVar71._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar151;
          auVar71._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar151;
          auVar71._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar151;
          auVar71._16_4_ = fVar151 * 0.0;
          auVar71._20_4_ = fVar151 * 0.0;
          auVar71._24_4_ = fVar151 * 0.0;
          auVar71._28_4_ = fVar151;
          auVar191 = vcmpps_avx(local_380,auVar71,6);
          auVar10 = auVar175 & auVar191;
          auVar166 = ZEXT3264(local_580);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
            auVar149 = ZEXT3264(local_5a0);
            auVar202 = ZEXT3264(CONCAT428(fStack_4e4,
                                          CONCAT424(fStack_4e8,
                                                    CONCAT420(fStack_4ec,
                                                              CONCAT416(fStack_4f0,
                                                                        CONCAT412(fStack_4f4,
                                                                                  CONCAT48(
                                                  fStack_4f8,CONCAT44(fStack_4fc,local_500))))))));
            goto LAB_011747f0;
          }
          auVar145._8_4_ = 0xbf800000;
          auVar145._0_8_ = 0xbf800000bf800000;
          auVar145._12_4_ = 0xbf800000;
          auVar145._16_4_ = 0xbf800000;
          auVar145._20_4_ = 0xbf800000;
          auVar145._24_4_ = 0xbf800000;
          auVar145._28_4_ = 0xbf800000;
          auVar165._8_4_ = 0x40000000;
          auVar165._0_8_ = 0x4000000040000000;
          auVar165._12_4_ = 0x40000000;
          auVar165._16_4_ = 0x40000000;
          auVar165._20_4_ = 0x40000000;
          auVar165._24_4_ = 0x40000000;
          auVar165._28_4_ = 0x40000000;
          auVar21 = vfmadd213ps_fma(local_3a0,auVar165,auVar145);
          local_2a0 = local_5a0;
          local_3a0 = ZEXT1632(auVar21);
          auVar10 = local_3a0;
          local_280 = ZEXT1632(auVar21);
          local_260 = local_380;
          local_23c = iVar14;
          local_230 = local_6d0;
          uStack_228 = uStack_6c8;
          local_220 = local_6e0;
          uStack_218 = uStack_6d8;
          local_210 = local_6f0;
          uStack_208 = uStack_6e8;
          local_200 = CONCAT44(fStack_6fc,local_700);
          uStack_1f8 = CONCAT44(fStack_6f4,fStack_6f8);
          pGVar103 = (context->scene->geometries).items[local_788].ptr;
          auVar12._4_4_ = fStack_4fc;
          auVar12._0_4_ = local_500;
          auVar12._8_4_ = fStack_4f8;
          auVar12._12_4_ = fStack_4f4;
          auVar12._16_4_ = fStack_4f0;
          auVar12._20_4_ = fStack_4ec;
          auVar12._24_4_ = fStack_4e8;
          auVar12._28_4_ = fStack_4e4;
          if ((pGVar103->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar191 = vandps_avx(auVar191,auVar175);
            local_480[0] = auVar191;
            fVar151 = (float)local_240;
            local_1c0[0] = (fVar151 + local_5a0._0_4_ + 0.0) * local_140;
            local_1c0[1] = (fVar151 + local_5a0._4_4_ + 1.0) * fStack_13c;
            local_1c0[2] = (fVar151 + local_5a0._8_4_ + 2.0) * fStack_138;
            local_1c0[3] = (fVar151 + local_5a0._12_4_ + 3.0) * fStack_134;
            fStack_1b0 = (fVar151 + local_5a0._16_4_ + 4.0) * fStack_130;
            fStack_1ac = (fVar151 + local_5a0._20_4_ + 5.0) * fStack_12c;
            fStack_1a8 = (fVar151 + local_5a0._24_4_ + 6.0) * fStack_128;
            fStack_1a4 = fVar151 + local_5a0._28_4_ + 7.0;
            local_3a0._0_8_ = auVar21._0_8_;
            local_3a0._8_8_ = auVar21._8_8_;
            local_1a0 = local_3a0._0_8_;
            uStack_198 = local_3a0._8_8_;
            uStack_190 = 0;
            uStack_188 = 0;
            local_180 = local_380;
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar115 = vblendvps_avx(auVar146,local_380,auVar191);
            auVar164 = vshufps_avx(auVar115,auVar115,0xb1);
            auVar164 = vminps_avx(auVar115,auVar164);
            auVar161 = vshufpd_avx(auVar164,auVar164,5);
            auVar164 = vminps_avx(auVar164,auVar161);
            auVar161 = vpermpd_avx2(auVar164,0x4e);
            auVar164 = vminps_avx(auVar164,auVar161);
            auVar115 = vcmpps_avx(auVar115,auVar164,0);
            auVar164 = auVar191 & auVar115;
            if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar164 >> 0x7f,0) != '\0') ||
                  (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0xbf,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar164[0x1f] < '\0') {
              auVar191 = vandps_avx(auVar115,auVar191);
            }
            uVar99 = vmovmskps_avx(auVar191);
            uVar97 = 0;
            for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
              uVar97 = uVar97 + 1;
            }
            uVar100 = (ulong)uVar97;
            local_3a0 = auVar10;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar103->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_760 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_780._0_8_ = pGVar103;
              do {
                local_604 = local_1c0[uVar100];
                local_600 = *(undefined4 *)((long)&local_1a0 + uVar100 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar100 * 4);
                fVar151 = 1.0 - local_604;
                auVar114 = ZEXT416((uint)local_604);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                          ZEXT416(0xc0a00000));
                auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_604 * local_604 * 3.0)),
                                          ZEXT416((uint)(local_604 + local_604)),auVar21);
                auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,
                                          ZEXT416(0x40000000));
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * -3.0)),
                                          ZEXT416((uint)(fVar151 + fVar151)),auVar21);
                auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(local_604 * (fVar151 + fVar151))),
                                           ZEXT416((uint)fVar151),ZEXT416((uint)fVar151));
                auVar114 = vfmadd231ss_fma(ZEXT416((uint)(local_604 * local_604)),auVar114,
                                           ZEXT416((uint)(fVar151 * -2.0)));
                fVar151 = auVar21._0_4_ * 0.5;
                fVar124 = auVar114._0_4_ * 0.5;
                auVar179._0_4_ = fVar124 * local_700;
                auVar179._4_4_ = fVar124 * fStack_6fc;
                auVar179._8_4_ = fVar124 * fStack_6f8;
                auVar179._12_4_ = fVar124 * fStack_6f4;
                auVar157._4_4_ = fVar151;
                auVar157._0_4_ = fVar151;
                auVar157._8_4_ = fVar151;
                auVar157._12_4_ = fVar151;
                auVar87._8_8_ = uStack_6e8;
                auVar87._0_8_ = local_6f0;
                auVar21 = vfmadd132ps_fma(auVar157,auVar179,auVar87);
                fVar151 = auVar18._0_4_ * 0.5;
                auVar180._4_4_ = fVar151;
                auVar180._0_4_ = fVar151;
                auVar180._8_4_ = fVar151;
                auVar180._12_4_ = fVar151;
                auVar90._8_8_ = uStack_6d8;
                auVar90._0_8_ = local_6e0;
                auVar21 = vfmadd132ps_fma(auVar180,auVar21,auVar90);
                fVar151 = auVar19._0_4_ * 0.5;
                auVar158._4_4_ = fVar151;
                auVar158._0_4_ = fVar151;
                auVar158._8_4_ = fVar151;
                auVar158._12_4_ = fVar151;
                auVar93._8_8_ = uStack_6c8;
                auVar93._0_8_ = local_6d0;
                auVar21 = vfmadd132ps_fma(auVar158,auVar21,auVar93);
                local_6b0.context = context->user;
                local_610 = vmovlps_avx(auVar21);
                local_608 = vextractps_avx(auVar21,2);
                local_5fc = (int)local_708;
                local_5f8 = (int)local_788;
                local_5f4 = (local_6b0.context)->instID[0];
                local_5f0 = (local_6b0.context)->instPrimID[0];
                local_78c = -1;
                local_6b0.valid = &local_78c;
                local_6b0.geometryUserPtr = pGVar103->userPtr;
                local_6b0.ray = (RTCRayN *)ray;
                local_6b0.hit = (RTCHitN *)&local_610;
                local_6b0.N = 1;
                local_740._0_8_ = uVar100;
                if (pGVar103->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01174cd4:
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar103->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar231 = ZEXT1664(auVar231._0_16_);
                    auVar233 = ZEXT1664(auVar233._0_16_);
                    (*p_Var15)(&local_6b0);
                    pGVar103 = (Geometry *)local_780._0_8_;
                    uVar100 = local_740._0_8_;
                    if (*local_6b0.valid == 0) goto LAB_01174d78;
                  }
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_6b0.hit;
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_6b0.hit + 4);
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_6b0.hit + 8);
                  *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                  *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                  *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                  *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                  *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                  *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                }
                else {
                  auVar231 = ZEXT1664(auVar231._0_16_);
                  auVar233 = ZEXT1664(auVar233._0_16_);
                  (*pGVar103->intersectionFilterN)(&local_6b0);
                  pGVar103 = (Geometry *)local_780._0_8_;
                  uVar100 = local_740._0_8_;
                  if (*local_6b0.valid != 0) goto LAB_01174cd4;
LAB_01174d78:
                  (ray->super_RayK<1>).tfar = (float)local_760._0_4_;
                  pGVar103 = (Geometry *)local_780._0_8_;
                  uVar100 = local_740._0_8_;
                }
                *(undefined4 *)(local_480[0] + uVar100 * 4) = 0;
                auVar115 = local_480[0];
                fVar151 = (ray->super_RayK<1>).tfar;
                auVar122._4_4_ = fVar151;
                auVar122._0_4_ = fVar151;
                auVar122._8_4_ = fVar151;
                auVar122._12_4_ = fVar151;
                auVar122._16_4_ = fVar151;
                auVar122._20_4_ = fVar151;
                auVar122._24_4_ = fVar151;
                auVar122._28_4_ = fVar151;
                auVar10 = vcmpps_avx(local_380,auVar122,2);
                auVar191 = vandps_avx(auVar10,local_480[0]);
                local_480[0] = auVar191;
                auVar115 = auVar115 & auVar10;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar115 >> 0x7f,0) == '\0') &&
                      (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0xbf,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar115[0x1f]) goto LAB_01174e11;
                auVar147._8_4_ = 0x7f800000;
                auVar147._0_8_ = 0x7f8000007f800000;
                auVar147._12_4_ = 0x7f800000;
                auVar147._16_4_ = 0x7f800000;
                auVar147._20_4_ = 0x7f800000;
                auVar147._24_4_ = 0x7f800000;
                auVar147._28_4_ = 0x7f800000;
                auVar10 = vblendvps_avx(auVar147,local_380,auVar191);
                auVar115 = vshufps_avx(auVar10,auVar10,0xb1);
                auVar115 = vminps_avx(auVar10,auVar115);
                auVar164 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar164);
                auVar164 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar164);
                auVar10 = vcmpps_avx(auVar10,auVar115,0);
                auVar115 = auVar191 & auVar10;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0x7f,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0xbf,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar115[0x1f] < '\0') {
                  auVar191 = vandps_avx(auVar10,auVar191);
                }
                local_760 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar99 = vmovmskps_avx(auVar191);
                uVar97 = 0;
                for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                  uVar97 = uVar97 + 1;
                }
                uVar100 = (ulong)uVar97;
              } while( true );
            }
            fVar151 = local_1c0[uVar100];
            fVar124 = 1.0 - fVar151;
            auVar114 = ZEXT416((uint)fVar151);
            auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,ZEXT416(0xc0a00000));
            auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151 * 3.0)),
                                      ZEXT416((uint)(fVar151 + fVar151)),auVar21);
            auVar21 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar114,ZEXT416(0x40000000));
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * fVar124 * -3.0)),
                                      ZEXT416((uint)(fVar124 + fVar124)),auVar21);
            auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar151 * (fVar124 + fVar124))),
                                       ZEXT416((uint)fVar124),ZEXT416((uint)fVar124));
            auVar114 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),auVar114,
                                       ZEXT416((uint)(fVar124 * -2.0)));
            fVar124 = auVar21._0_4_ * 0.5;
            fVar125 = auVar114._0_4_ * 0.5;
            auVar171._0_4_ = fVar125 * local_700;
            auVar171._4_4_ = fVar125 * fStack_6fc;
            auVar171._8_4_ = fVar125 * fStack_6f8;
            auVar171._12_4_ = fVar125 * fStack_6f4;
            auVar135._4_4_ = fVar124;
            auVar135._0_4_ = fVar124;
            auVar135._8_4_ = fVar124;
            auVar135._12_4_ = fVar124;
            auVar86._8_8_ = uStack_6e8;
            auVar86._0_8_ = local_6f0;
            auVar21 = vfmadd132ps_fma(auVar135,auVar171,auVar86);
            fVar124 = auVar18._0_4_ * 0.5;
            auVar172._4_4_ = fVar124;
            auVar172._0_4_ = fVar124;
            auVar172._8_4_ = fVar124;
            auVar172._12_4_ = fVar124;
            auVar89._8_8_ = uStack_6d8;
            auVar89._0_8_ = local_6e0;
            auVar21 = vfmadd132ps_fma(auVar172,auVar21,auVar89);
            fVar124 = *(float *)((long)&local_1a0 + uVar100 * 4);
            fVar125 = auVar19._0_4_ * 0.5;
            auVar156._4_4_ = fVar125;
            auVar156._0_4_ = fVar125;
            auVar156._8_4_ = fVar125;
            auVar156._12_4_ = fVar125;
            auVar92._8_8_ = uStack_6c8;
            auVar92._0_8_ = local_6d0;
            auVar21 = vfmadd132ps_fma(auVar156,auVar21,auVar92);
            (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar100 * 4);
            uVar108 = vmovlps_avx(auVar21);
            *(undefined8 *)&(ray->Ng).field_0 = uVar108;
            fVar125 = (float)vextractps_avx(auVar21,2);
            (ray->Ng).field_0.field_0.z = fVar125;
            ray->u = fVar151;
            ray->v = fVar124;
            ray->primID = (uint)local_708;
            ray->geomID = (uint)local_788;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            prim = local_6c0;
            goto LAB_01174788;
          }
          goto LAB_0117479a;
        }
        auVar149 = ZEXT3264(auVar149._0_32_);
        auVar240 = ZEXT3264(local_640);
        auVar202 = ZEXT3264(CONCAT428(fStack_4e4,
                                      CONCAT424(fStack_4e8,
                                                CONCAT420(fStack_4ec,
                                                          CONCAT416(fStack_4f0,
                                                                    CONCAT412(fStack_4f4,
                                                                              CONCAT48(fStack_4f8,
                                                                                       CONCAT44(
                                                  fStack_4fc,local_500))))))));
        auVar215 = ZEXT3264(auVar215._0_32_);
        auVar166 = ZEXT3264(auVar163);
        auVar239 = ZEXT3264(local_680);
        goto LAB_011747f0;
      }
    }
    fVar151 = (ray->super_RayK<1>).tfar;
    auVar113._4_4_ = fVar151;
    auVar113._0_4_ = fVar151;
    auVar113._8_4_ = fVar151;
    auVar113._12_4_ = fVar151;
    auVar21 = vcmpps_avx(local_2c0,auVar113,2);
    uVar97 = vmovmskps_avx(auVar21);
    uVar106 = (ulong)((uint)uVar106 & uVar97);
  } while( true );
LAB_01174e11:
  auVar240 = ZEXT3264(local_640);
  auVar215 = ZEXT3264(CONCAT428(fStack_544,
                                CONCAT424(fStack_548,
                                          CONCAT420(fStack_54c,
                                                    CONCAT416(fStack_550,
                                                              CONCAT412(fStack_554,
                                                                        CONCAT48(fStack_558,
                                                                                 CONCAT44(fStack_55c
                                                                                          ,local_560
                                                                                         ))))))));
  auVar239 = ZEXT3264(local_680);
  pre = local_6b8;
  prim = local_6c0;
LAB_01174788:
  auVar12._4_4_ = fStack_4fc;
  auVar12._0_4_ = local_500;
  auVar12._8_4_ = fStack_4f8;
  auVar12._12_4_ = fStack_4f4;
  auVar12._16_4_ = fStack_4f0;
  auVar12._20_4_ = fStack_4ec;
  auVar12._24_4_ = fStack_4e8;
  auVar12._28_4_ = fStack_4e4;
LAB_0117479a:
  auVar149 = ZEXT3264(local_5a0);
  auVar202 = ZEXT3264(auVar12);
  auVar166 = ZEXT3264(local_580);
LAB_011747f0:
  lVar107 = lVar107 + 8;
  auVar176 = ZEXT3264(local_4a0);
  goto LAB_01173fc2;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }